

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakF-1600-opt64.c
# Opt level: O3

void KeccakPermutationOnWordsAfterXoring1152bits(UINT64 *state,UINT64 *input)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  
  uVar36 = input[10] ^ state[10] ^ input[0xf] ^ state[0xf] ^ input[5] ^ state[5] ^ *input ^ *state ^
           state[0x14];
  uVar21 = input[0xb] ^ state[0xb] ^ input[0x10] ^ state[0x10] ^
           input[6] ^ state[6] ^ input[1] ^ state[1] ^ state[0x15];
  uVar16 = input[0xc] ^ state[0xc] ^ input[0x11] ^ state[0x11] ^
           input[7] ^ state[7] ^ input[2] ^ state[2] ^ state[0x16];
  uVar5 = input[0xd] ^ state[0xd] ^ state[0x12] ^ input[8] ^ state[8] ^ input[3] ^ state[3] ^
          state[0x17];
  uVar4 = input[0xe] ^ state[0xe] ^ state[0x13] ^ input[9] ^ state[9] ^ input[4] ^ state[4] ^
          state[0x18];
  uVar2 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar4;
  uVar3 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar36;
  uVar27 = input[6] ^ state[6] ^ uVar3;
  uVar28 = uVar27 << 0x2c | uVar27 >> 0x14;
  uVar21 = (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^ uVar21;
  uVar27 = input[0xc] ^ state[0xc] ^ uVar21;
  uVar9 = uVar27 << 0x2b | uVar27 >> 0x15;
  uVar16 = (uVar4 << 1 | (ulong)((long)uVar4 < 0)) ^ uVar16;
  uVar4 = state[0x12] ^ uVar16;
  uVar4 = uVar4 << 0x15 | uVar4 >> 0x2b;
  uVar5 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar5;
  uVar27 = state[0x18] ^ uVar5;
  uVar1 = uVar27 << 0xe | uVar27 >> 0x32;
  uVar6 = *input ^ *state ^ uVar2;
  uVar22 = (uVar1 | uVar6) ^ uVar4;
  uVar27 = uVar4 & uVar1 ^ uVar9;
  uVar36 = input[3] ^ state[3] ^ uVar16;
  uVar23 = uVar36 << 0x1c | uVar36 >> 0x24;
  uVar17 = (~uVar9 | uVar4) ^ uVar28;
  uVar4 = input[9] ^ state[9] ^ uVar5;
  uVar4 = uVar4 << 0x14 | uVar4 >> 0x2c;
  uVar36 = input[10] ^ state[10] ^ uVar2;
  uVar29 = uVar36 << 3 | uVar36 >> 0x3d;
  uVar1 = uVar28 & uVar6 ^ uVar1;
  uVar36 = input[0x10] ^ state[0x10] ^ uVar3;
  uVar33 = uVar36 << 0x2d | uVar36 >> 0x13;
  uVar36 = state[0x16] ^ uVar21;
  uVar8 = uVar36 << 0x3d | uVar36 >> 3;
  uVar36 = (~uVar8 | uVar33) ^ uVar29;
  uVar30 = (uVar29 | uVar4) ^ uVar23;
  uVar29 = uVar29 & uVar33 ^ uVar4;
  uVar10 = input[1] ^ state[1] ^ uVar3;
  uVar11 = uVar10 << 1 | (ulong)((long)uVar10 < 0);
  uVar10 = input[7] ^ state[7] ^ uVar21;
  uVar10 = uVar10 << 6 | uVar10 >> 0x3a;
  uVar15 = input[0xd] ^ state[0xd] ^ uVar16;
  uVar15 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar24 = state[0x13] ^ uVar5;
  uVar24 = uVar24 << 8 | uVar24 >> 0x38;
  uVar33 = (uVar23 | uVar8) ^ uVar33;
  uVar38 = state[0x14] ^ uVar2;
  uVar38 = uVar38 << 0x12 | uVar38 >> 0x2e;
  uVar8 = uVar4 & uVar23 ^ uVar8;
  uVar25 = ~uVar24;
  uVar31 = uVar38 & uVar25 ^ uVar15;
  uVar7 = (uVar15 | uVar10) ^ uVar11;
  uVar23 = uVar15 & uVar24 ^ uVar10;
  uVar4 = uVar10 & uVar11 ^ uVar38;
  uVar10 = input[5] ^ state[5] ^ uVar2;
  uVar10 = uVar10 << 0x24 | uVar10 >> 0x1c;
  uVar15 = input[0xb] ^ state[0xb] ^ uVar3;
  uVar15 = uVar15 << 10 | uVar15 >> 0x36;
  uVar24 = input[0x11] ^ state[0x11] ^ uVar21;
  uVar12 = uVar24 << 0xf | uVar24 >> 0x31;
  uVar25 = (uVar38 | uVar11) ^ uVar25;
  uVar11 = state[0x17] ^ uVar16;
  uVar11 = uVar11 << 0x38 | uVar11 >> 8;
  uVar13 = ~uVar12;
  uVar39 = (uVar11 | uVar13) ^ uVar15;
  uVar24 = input[4] ^ state[4] ^ uVar5;
  uVar38 = uVar24 << 0x1b | uVar24 >> 0x25;
  uVar18 = (uVar12 | uVar15) ^ uVar10;
  uVar24 = (uVar10 | uVar38) ^ uVar11;
  uVar10 = uVar10 & uVar15 ^ uVar38;
  uVar13 = uVar11 & uVar38 ^ uVar13;
  uVar21 = uVar21 ^ input[2] ^ state[2];
  uVar16 = uVar16 ^ input[8] ^ state[8];
  uVar5 = uVar5 ^ input[0xe] ^ state[0xe];
  uVar2 = uVar2 ^ input[0xf] ^ state[0xf];
  uVar16 = uVar16 << 0x37 | uVar16 >> 9;
  uVar38 = uVar5 << 0x27 | uVar5 >> 0x19;
  uVar2 = uVar2 << 0x29 | uVar2 >> 0x17;
  uVar3 = uVar3 ^ state[0x15];
  uVar3 = uVar3 << 2 | uVar3 >> 0x3e;
  uVar15 = ~uVar16;
  uVar14 = uVar2 & uVar3 ^ uVar38;
  uVar12 = (uVar2 | uVar38) ^ uVar15;
  uVar5 = uVar17 ^ uVar23 ^ uVar18 ^ uVar29 ^ uVar12;
  uVar19 = uVar14 ^ uVar27 ^ uVar39 ^ uVar31 ^ uVar36;
  uVar11 = uVar21 << 0x3e | uVar21 >> 2;
  uVar34 = uVar38 & uVar15 ^ uVar11;
  uVar2 = (uVar11 | uVar3) ^ uVar2;
  uVar3 = uVar16 & uVar11 ^ uVar3;
  uVar37 = (uVar9 | uVar28) ^ uVar6 ^ 1;
  uVar38 = uVar2 ^ uVar33 ^ uVar25 ^ uVar22 ^ uVar13;
  uVar15 = (uVar38 << 1 | (ulong)((long)uVar38 < 0)) ^ uVar5;
  uVar11 = uVar24 ^ uVar8 ^ uVar4 ^ uVar1 ^ uVar3;
  uVar28 = (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^ uVar11;
  uVar26 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar19;
  uVar11 = uVar7 ^ uVar34 ^ uVar30 ^ uVar10 ^ uVar37;
  uVar20 = (uVar19 << 1 | (ulong)((long)uVar19 < 0)) ^ uVar11;
  uVar38 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar38;
  uVar29 = uVar29 ^ uVar20;
  uVar19 = uVar29 << 0x2c | uVar29 >> 0x14;
  uVar37 = uVar37 ^ uVar28;
  uVar31 = uVar31 ^ uVar15;
  uVar32 = uVar31 << 0x2b | uVar31 >> 0x15;
  uVar13 = uVar13 ^ uVar26;
  uVar9 = uVar13 << 0x15 | uVar13 >> 0x2b;
  uVar3 = uVar3 ^ uVar38;
  uVar11 = uVar3 << 0xe | uVar3 >> 0x32;
  uVar29 = uVar9 & uVar11 ^ uVar32;
  uVar31 = (~uVar32 | uVar9) ^ uVar19;
  uVar22 = uVar22 ^ uVar26;
  uVar13 = uVar22 << 0x1c | uVar22 >> 0x24;
  uVar6 = uVar19 & uVar37 ^ uVar11;
  uVar8 = uVar8 ^ uVar38;
  uVar21 = uVar8 << 0x14 | uVar8 >> 0x2c;
  uVar7 = uVar7 ^ uVar28;
  uVar3 = uVar7 << 3 | uVar7 >> 0x3d;
  uVar18 = uVar18 ^ uVar20;
  uVar18 = uVar18 << 0x2d | uVar18 >> 0x13;
  uVar9 = (uVar11 | uVar37) ^ uVar9;
  uVar14 = uVar14 ^ uVar15;
  uVar8 = uVar14 << 0x3d | uVar14 >> 3;
  uVar11 = (~uVar8 | uVar18) ^ uVar3;
  uVar5 = (uVar3 | uVar21) ^ uVar13;
  uVar3 = uVar3 & uVar18 ^ uVar21;
  uVar16 = uVar21 & uVar13 ^ uVar8;
  uVar36 = uVar36 ^ uVar15;
  uVar21 = uVar36 << 6 | uVar36 >> 0x3a;
  uVar25 = uVar25 ^ uVar26;
  uVar7 = uVar25 << 0x19 | uVar25 >> 0x27;
  uVar18 = (uVar8 | uVar13) ^ uVar18;
  uVar24 = uVar24 ^ uVar38;
  uVar36 = uVar24 << 8 | uVar24 >> 0x38;
  uVar34 = uVar34 ^ uVar28;
  uVar13 = uVar34 << 0x12 | uVar34 >> 0x2e;
  uVar8 = ~uVar36;
  uVar24 = uVar13 & uVar8 ^ uVar7;
  uVar17 = uVar17 ^ uVar20;
  uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar36 = uVar7 & uVar36 ^ uVar21;
  uVar14 = uVar21 & uVar17 ^ uVar13;
  uVar30 = uVar30 ^ uVar28;
  uVar22 = uVar30 << 0x24 | uVar30 >> 0x1c;
  uVar23 = uVar23 ^ uVar20;
  uVar23 = uVar23 << 10 | uVar23 >> 0x36;
  uVar25 = (uVar21 | uVar7) ^ uVar17;
  uVar39 = uVar39 ^ uVar15;
  uVar7 = uVar39 << 0xf | uVar39 >> 0x31;
  uVar2 = uVar2 ^ uVar26;
  uVar21 = uVar2 << 0x38 | uVar2 >> 8;
  uVar8 = (uVar13 | uVar17) ^ uVar8;
  uVar39 = ~uVar7;
  uVar30 = (uVar21 | uVar39) ^ uVar23;
  uVar1 = uVar1 ^ uVar38;
  uVar13 = uVar1 << 0x1b | uVar1 >> 0x25;
  uVar17 = (uVar23 | uVar7) ^ uVar22;
  uVar1 = (uVar22 | uVar13) ^ uVar21;
  uVar2 = uVar22 & uVar23 ^ uVar13;
  uVar39 = uVar21 & uVar13 ^ uVar39;
  uVar15 = uVar15 ^ uVar27;
  uVar26 = uVar26 ^ uVar33;
  uVar38 = uVar38 ^ uVar4;
  uVar28 = uVar28 ^ uVar10;
  uVar20 = uVar20 ^ uVar12;
  uVar27 = uVar15 << 0x3e | uVar15 >> 2;
  uVar10 = uVar26 << 0x37 | uVar26 >> 9;
  uVar4 = uVar38 << 0x27 | uVar38 >> 0x19;
  uVar7 = uVar28 << 0x29 | uVar28 >> 0x17;
  uVar15 = uVar20 << 2 | uVar20 >> 0x3e;
  uVar38 = ~uVar10;
  uVar33 = uVar10 & uVar27 ^ uVar15;
  uVar10 = (uVar15 | uVar27) ^ uVar7;
  uVar23 = uVar7 & uVar15 ^ uVar4;
  uVar27 = uVar4 & uVar38 ^ uVar27;
  uVar21 = (uVar19 | uVar32) ^ uVar37 ^ 0x8082;
  uVar12 = uVar2 ^ uVar27 ^ uVar5 ^ uVar25 ^ uVar21;
  uVar38 = (uVar7 | uVar4) ^ uVar38;
  uVar26 = uVar17 ^ uVar38 ^ uVar3 ^ uVar36 ^ uVar31;
  uVar22 = uVar24 ^ uVar30 ^ uVar29 ^ uVar11 ^ uVar23;
  uVar13 = uVar8 ^ uVar39 ^ uVar18 ^ uVar9 ^ uVar10;
  uVar4 = uVar14 ^ uVar1 ^ uVar6 ^ uVar16 ^ uVar33;
  uVar19 = (uVar26 << 1 | (ulong)((long)uVar26 < 0)) ^ uVar4;
  uVar7 = (uVar22 << 1 | (ulong)((long)uVar22 < 0)) ^ uVar12;
  uVar26 = (uVar13 << 1 | (ulong)((long)uVar13 < 0)) ^ uVar26;
  uVar3 = uVar3 ^ uVar7;
  uVar15 = uVar3 << 0x2c | uVar3 >> 0x14;
  uVar22 = (uVar4 << 1 | (ulong)((long)uVar4 < 0)) ^ uVar22;
  uVar24 = uVar24 ^ uVar26;
  uVar4 = uVar24 << 0x2b | uVar24 >> 0x15;
  uVar13 = (uVar12 << 1 | (ulong)((long)uVar12 < 0)) ^ uVar13;
  uVar39 = uVar39 ^ uVar22;
  uVar20 = uVar39 << 0x15 | uVar39 >> 0x2b;
  uVar21 = uVar21 ^ uVar19;
  uVar39 = uVar21 ^ 0x800000000000808a ^ (uVar15 | uVar4);
  uVar33 = uVar33 ^ uVar13;
  uVar3 = uVar33 << 0xe | uVar33 >> 0x32;
  uVar12 = uVar20 & uVar3 ^ uVar4;
  uVar28 = (~uVar4 | uVar20) ^ uVar15;
  uVar33 = uVar15 & uVar21 ^ uVar3;
  uVar9 = uVar9 ^ uVar22;
  uVar32 = uVar9 << 0x1c | uVar9 >> 0x24;
  uVar16 = uVar16 ^ uVar13;
  uVar4 = uVar16 << 0x14 | uVar16 >> 0x2c;
  uVar25 = uVar25 ^ uVar19;
  uVar15 = uVar25 << 3 | uVar25 >> 0x3d;
  uVar20 = (uVar3 | uVar21) ^ uVar20;
  uVar17 = uVar17 ^ uVar7;
  uVar25 = uVar17 << 0x2d | uVar17 >> 0x13;
  uVar23 = uVar23 ^ uVar26;
  uVar16 = uVar23 << 0x3d | uVar23 >> 3;
  uVar21 = (uVar4 | uVar15) ^ uVar32;
  uVar3 = (~uVar16 | uVar25) ^ uVar15;
  uVar23 = uVar15 & uVar25 ^ uVar4;
  uVar31 = uVar31 ^ uVar7;
  uVar24 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar11 = uVar11 ^ uVar26;
  uVar9 = uVar11 << 6 | uVar11 >> 0x3a;
  uVar15 = uVar4 & uVar32 ^ uVar16;
  uVar8 = uVar8 ^ uVar22;
  uVar11 = uVar8 << 0x19 | uVar8 >> 0x27;
  uVar1 = uVar1 ^ uVar13;
  uVar4 = uVar1 << 8 | uVar1 >> 0x38;
  uVar27 = uVar27 ^ uVar19;
  uVar1 = uVar27 << 0x12 | uVar27 >> 0x2e;
  uVar25 = (uVar16 | uVar32) ^ uVar25;
  uVar27 = ~uVar4;
  uVar17 = uVar1 & uVar27 ^ uVar11;
  uVar16 = uVar11 & uVar4 ^ uVar9;
  uVar32 = uVar9 & uVar24 ^ uVar1;
  uVar31 = (uVar9 | uVar11) ^ uVar24;
  uVar27 = (uVar1 | uVar24) ^ uVar27;
  uVar5 = uVar5 ^ uVar19;
  uVar1 = uVar5 << 0x24 | uVar5 >> 0x1c;
  uVar36 = uVar36 ^ uVar7;
  uVar24 = uVar36 << 10 | uVar36 >> 0x36;
  uVar30 = uVar30 ^ uVar26;
  uVar9 = uVar30 << 0xf | uVar30 >> 0x31;
  uVar4 = (uVar24 | uVar9) ^ uVar1;
  uVar10 = uVar10 ^ uVar22;
  uVar36 = uVar10 << 0x38 | uVar10 >> 8;
  uVar9 = ~uVar9;
  uVar5 = (uVar36 | uVar9) ^ uVar24;
  uVar6 = uVar6 ^ uVar13;
  uVar10 = uVar6 << 0x1b | uVar6 >> 0x25;
  uVar11 = (uVar1 | uVar10) ^ uVar36;
  uVar6 = uVar1 & uVar24 ^ uVar10;
  uVar9 = uVar36 & uVar10 ^ uVar9;
  uVar26 = uVar26 ^ uVar29;
  uVar22 = uVar22 ^ uVar18;
  uVar13 = uVar13 ^ uVar14;
  uVar19 = uVar19 ^ uVar2;
  uVar7 = uVar7 ^ uVar38;
  uVar8 = uVar26 << 0x3e | uVar26 >> 2;
  uVar38 = uVar22 << 0x37 | uVar22 >> 9;
  uVar24 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar36 = uVar19 << 0x29 | uVar19 >> 0x17;
  uVar29 = uVar7 << 2 | uVar7 >> 0x3e;
  uVar10 = ~uVar38;
  uVar2 = (uVar29 | uVar8) ^ uVar36;
  uVar1 = uVar36 & uVar29 ^ uVar24;
  uVar22 = (uVar24 | uVar36) ^ uVar10;
  uVar36 = uVar9 ^ uVar2 ^ uVar20 ^ uVar25 ^ uVar27;
  uVar24 = uVar24 & uVar10 ^ uVar8;
  uVar29 = uVar38 & uVar8 ^ uVar29;
  uVar10 = uVar16 ^ uVar4 ^ uVar28 ^ uVar23 ^ uVar22;
  uVar38 = uVar17 ^ uVar5 ^ uVar12 ^ uVar3 ^ uVar1;
  uVar13 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar10;
  uVar8 = uVar32 ^ uVar11 ^ uVar33 ^ uVar15 ^ uVar29;
  uVar7 = (uVar10 << 1 | (ulong)((long)uVar10 < 0)) ^ uVar8;
  uVar34 = (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar38;
  uVar10 = uVar6 ^ uVar24 ^ uVar21 ^ uVar31 ^ uVar39;
  uVar30 = (uVar38 << 1 | (ulong)((long)uVar38 < 0)) ^ uVar10;
  uVar36 = (uVar10 << 1 | (ulong)((long)uVar10 < 0)) ^ uVar36;
  uVar23 = uVar23 ^ uVar30;
  uVar10 = uVar23 << 0x2c | uVar23 >> 0x14;
  uVar39 = uVar39 ^ uVar7;
  uVar17 = uVar17 ^ uVar13;
  uVar38 = uVar17 << 0x2b | uVar17 >> 0x15;
  uVar9 = uVar9 ^ uVar34;
  uVar19 = uVar9 << 0x15 | uVar9 >> 0x2b;
  uVar17 = uVar39 ^ 0x8000000080008000 ^ (uVar10 | uVar38);
  uVar29 = uVar29 ^ uVar36;
  uVar23 = uVar29 << 0xe | uVar29 >> 0x32;
  uVar29 = uVar19 & uVar23 ^ uVar38;
  uVar8 = (~uVar38 | uVar19) ^ uVar10;
  uVar10 = uVar10 & uVar39 ^ uVar23;
  uVar20 = uVar20 ^ uVar34;
  uVar9 = uVar20 << 0x1c | uVar20 >> 0x24;
  uVar15 = uVar15 ^ uVar36;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0x2c;
  uVar31 = uVar31 ^ uVar7;
  uVar14 = uVar31 << 3 | uVar31 >> 0x3d;
  uVar19 = (uVar23 | uVar39) ^ uVar19;
  uVar4 = uVar4 ^ uVar30;
  uVar39 = uVar4 << 0x2d | uVar4 >> 0x13;
  uVar1 = uVar1 ^ uVar13;
  uVar38 = uVar1 << 0x3d | uVar1 >> 3;
  uVar31 = (uVar15 | uVar14) ^ uVar9;
  uVar1 = (~uVar38 | uVar39) ^ uVar14;
  uVar23 = uVar14 & uVar39 ^ uVar15;
  uVar28 = uVar28 ^ uVar30;
  uVar18 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar3 = uVar3 ^ uVar13;
  uVar4 = uVar3 << 6 | uVar3 >> 0x3a;
  uVar3 = uVar15 & uVar9 ^ uVar38;
  uVar27 = uVar27 ^ uVar34;
  uVar28 = uVar27 << 0x19 | uVar27 >> 0x27;
  uVar11 = uVar11 ^ uVar36;
  uVar27 = uVar11 << 8 | uVar11 >> 0x38;
  uVar24 = uVar24 ^ uVar7;
  uVar11 = uVar24 << 0x12 | uVar24 >> 0x2e;
  uVar39 = (uVar38 | uVar9) ^ uVar39;
  uVar15 = ~uVar27;
  uVar20 = uVar11 & uVar15 ^ uVar28;
  uVar38 = uVar28 & uVar27 ^ uVar4;
  uVar14 = uVar4 & uVar18 ^ uVar11;
  uVar9 = (uVar4 | uVar28) ^ uVar18;
  uVar15 = (uVar11 | uVar18) ^ uVar15;
  uVar33 = uVar33 ^ uVar36;
  uVar26 = uVar33 << 0x1b | uVar33 >> 0x25;
  uVar21 = uVar21 ^ uVar7;
  uVar27 = uVar21 << 0x24 | uVar21 >> 0x1c;
  uVar16 = uVar16 ^ uVar30;
  uVar24 = uVar16 << 10 | uVar16 >> 0x36;
  uVar18 = uVar27 & uVar24 ^ uVar26;
  uVar5 = uVar5 ^ uVar13;
  uVar11 = uVar5 << 0xf | uVar5 >> 0x31;
  uVar33 = (uVar24 | uVar11) ^ uVar27;
  uVar2 = uVar2 ^ uVar34;
  uVar4 = uVar2 << 0x38 | uVar2 >> 8;
  uVar11 = ~uVar11;
  uVar24 = (uVar4 | uVar11) ^ uVar24;
  uVar28 = (uVar27 | uVar26) ^ uVar4;
  uVar11 = uVar4 & uVar26 ^ uVar11;
  uVar13 = uVar13 ^ uVar12;
  uVar34 = uVar34 ^ uVar25;
  uVar36 = uVar36 ^ uVar32;
  uVar7 = uVar7 ^ uVar6;
  uVar30 = uVar30 ^ uVar22;
  uVar2 = uVar13 << 0x3e | uVar13 >> 2;
  uVar16 = uVar34 << 0x37 | uVar34 >> 9;
  uVar36 = uVar36 << 0x27 | uVar36 >> 0x19;
  uVar27 = uVar7 << 0x29 | uVar7 >> 0x17;
  uVar5 = uVar30 << 2 | uVar30 >> 0x3e;
  uVar6 = ~uVar16;
  uVar4 = (uVar5 | uVar2) ^ uVar27;
  uVar21 = uVar27 & uVar5 ^ uVar36;
  uVar32 = (uVar36 | uVar27) ^ uVar6;
  uVar12 = uVar36 & uVar6 ^ uVar2;
  uVar5 = uVar16 & uVar2 ^ uVar5;
  uVar27 = uVar38 ^ uVar33 ^ uVar8 ^ uVar23 ^ uVar32;
  uVar2 = uVar20 ^ uVar24 ^ uVar29 ^ uVar1 ^ uVar21;
  uVar36 = uVar15 ^ uVar11 ^ uVar19 ^ uVar39 ^ uVar4;
  uVar30 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar27;
  uVar16 = uVar14 ^ uVar28 ^ uVar10 ^ uVar3 ^ uVar5;
  uVar34 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar16;
  uVar37 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar2;
  uVar27 = uVar9 ^ uVar18 ^ uVar17 ^ uVar31 ^ uVar12;
  uVar6 = (uVar2 << 1 | (ulong)((long)uVar2 < 0)) ^ uVar27;
  uVar36 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar36;
  uVar23 = uVar23 ^ uVar6;
  uVar27 = uVar23 << 0x2c | uVar23 >> 0x14;
  uVar17 = uVar17 ^ uVar34;
  uVar20 = uVar20 ^ uVar30;
  uVar20 = uVar20 << 0x2b | uVar20 >> 0x15;
  uVar11 = uVar11 ^ uVar37;
  uVar7 = uVar11 << 0x15 | uVar11 >> 0x2b;
  uVar5 = uVar5 ^ uVar36;
  uVar23 = uVar5 << 0xe | uVar5 >> 0x32;
  uVar16 = uVar7 & uVar23 ^ uVar20;
  uVar5 = (~uVar20 | uVar7) ^ uVar27;
  uVar19 = uVar19 ^ uVar37;
  uVar19 = uVar19 << 0x1c | uVar19 >> 0x24;
  uVar11 = uVar27 & uVar17 ^ uVar23;
  uVar3 = uVar3 ^ uVar36;
  uVar2 = uVar3 << 0x14 | uVar3 >> 0x2c;
  uVar9 = uVar9 ^ uVar34;
  uVar3 = uVar9 << 3 | uVar9 >> 0x3d;
  uVar33 = uVar33 ^ uVar6;
  uVar25 = uVar33 << 0x2d | uVar33 >> 0x13;
  uVar7 = (uVar23 | uVar17) ^ uVar7;
  uVar21 = uVar21 ^ uVar30;
  uVar23 = uVar21 << 0x3d | uVar21 >> 3;
  uVar21 = (uVar2 | uVar3) ^ uVar19;
  uVar33 = (~uVar23 | uVar25) ^ uVar3;
  uVar3 = uVar3 & uVar25 ^ uVar2;
  uVar26 = uVar2 & uVar19 ^ uVar23;
  uVar1 = uVar1 ^ uVar30;
  uVar2 = uVar1 << 6 | uVar1 >> 0x3a;
  uVar15 = uVar15 ^ uVar37;
  uVar13 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar25 = (uVar23 | uVar19) ^ uVar25;
  uVar28 = uVar28 ^ uVar36;
  uVar15 = uVar28 << 8 | uVar28 >> 0x38;
  uVar12 = uVar12 ^ uVar34;
  uVar9 = uVar12 << 0x12 | uVar12 >> 0x2e;
  uVar12 = ~uVar15;
  uVar23 = uVar9 & uVar12 ^ uVar13;
  uVar8 = uVar8 ^ uVar6;
  uVar28 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar1 = uVar13 & uVar15 ^ uVar2;
  uVar15 = uVar2 & uVar28 ^ uVar9;
  uVar31 = uVar31 ^ uVar34;
  uVar19 = uVar31 << 0x24 | uVar31 >> 0x1c;
  uVar38 = uVar38 ^ uVar6;
  uVar22 = uVar38 << 10 | uVar38 >> 0x36;
  uVar31 = (uVar2 | uVar13) ^ uVar28;
  uVar24 = uVar24 ^ uVar30;
  uVar38 = uVar24 << 0xf | uVar24 >> 0x31;
  uVar4 = uVar4 ^ uVar37;
  uVar24 = uVar4 << 0x38 | uVar4 >> 8;
  uVar12 = (uVar9 | uVar28) ^ uVar12;
  uVar2 = ~uVar38;
  uVar8 = (uVar24 | uVar2) ^ uVar22;
  uVar10 = uVar10 ^ uVar36;
  uVar4 = uVar10 << 0x1b | uVar10 >> 0x25;
  uVar28 = (uVar22 | uVar38) ^ uVar19;
  uVar38 = (uVar19 | uVar4) ^ uVar24;
  uVar22 = uVar19 & uVar22 ^ uVar4;
  uVar2 = uVar24 & uVar4 ^ uVar2;
  uVar30 = uVar30 ^ uVar29;
  uVar37 = uVar37 ^ uVar39;
  uVar36 = uVar36 ^ uVar14;
  uVar34 = uVar34 ^ uVar18;
  uVar6 = uVar6 ^ uVar32;
  uVar29 = (uVar27 | uVar20) ^ uVar17 ^ 0x808b;
  uVar27 = uVar30 << 0x3e | uVar30 >> 2;
  uVar9 = uVar37 << 0x37 | uVar37 >> 9;
  uVar24 = uVar36 << 0x27 | uVar36 >> 0x19;
  uVar10 = uVar34 << 0x29 | uVar34 >> 0x17;
  uVar36 = uVar6 << 2 | uVar6 >> 0x3e;
  uVar18 = ~uVar9;
  uVar4 = (uVar36 | uVar27) ^ uVar10;
  uVar17 = uVar10 & uVar36 ^ uVar24;
  uVar39 = uVar24 & uVar18 ^ uVar27;
  uVar6 = uVar22 ^ uVar39 ^ uVar21 ^ uVar31 ^ uVar29;
  uVar18 = (uVar24 | uVar10) ^ uVar18;
  uVar24 = uVar28 ^ uVar18 ^ uVar3 ^ uVar1 ^ uVar5;
  uVar36 = uVar9 & uVar27 ^ uVar36;
  uVar9 = uVar23 ^ uVar8 ^ uVar16 ^ uVar33 ^ uVar17;
  uVar19 = uVar12 ^ uVar2 ^ uVar7 ^ uVar25 ^ uVar4;
  uVar27 = uVar15 ^ uVar38 ^ uVar11 ^ uVar26 ^ uVar36;
  uVar32 = (uVar24 << 1 | (ulong)((long)uVar24 < 0)) ^ uVar27;
  uVar30 = (uVar9 << 1 | (ulong)((long)uVar9 < 0)) ^ uVar6;
  uVar24 = (uVar19 << 1 | (ulong)((long)uVar19 < 0)) ^ uVar24;
  uVar3 = uVar3 ^ uVar30;
  uVar20 = uVar3 << 0x2c | uVar3 >> 0x14;
  uVar9 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar9;
  uVar23 = uVar23 ^ uVar24;
  uVar27 = uVar23 << 0x2b | uVar23 >> 0x15;
  uVar19 = (uVar6 << 1 | (ulong)((long)uVar6 < 0)) ^ uVar19;
  uVar2 = uVar2 ^ uVar9;
  uVar10 = uVar2 << 0x15 | uVar2 >> 0x2b;
  uVar29 = uVar29 ^ uVar32;
  uVar36 = uVar36 ^ uVar19;
  uVar2 = uVar36 << 0xe | uVar36 >> 0x32;
  uVar13 = uVar10 & uVar2 ^ uVar27;
  uVar6 = (~uVar27 | uVar10) ^ uVar20;
  uVar14 = uVar20 & uVar29 ^ uVar2;
  uVar7 = uVar7 ^ uVar9;
  uVar3 = uVar7 << 0x1c | uVar7 >> 0x24;
  uVar26 = uVar26 ^ uVar19;
  uVar36 = uVar26 << 0x14 | uVar26 >> 0x2c;
  uVar31 = uVar31 ^ uVar32;
  uVar7 = uVar31 << 3 | uVar31 >> 0x3d;
  uVar28 = uVar28 ^ uVar30;
  uVar28 = uVar28 << 0x2d | uVar28 >> 0x13;
  uVar20 = uVar29 ^ 0x80000001 ^ (uVar20 | uVar27);
  uVar17 = uVar17 ^ uVar24;
  uVar23 = uVar17 << 0x3d | uVar17 >> 3;
  uVar10 = (uVar2 | uVar29) ^ uVar10;
  uVar27 = (uVar36 | uVar7) ^ uVar3;
  uVar2 = (~uVar23 | uVar28) ^ uVar7;
  uVar26 = uVar7 & uVar28 ^ uVar36;
  uVar17 = uVar36 & uVar3 ^ uVar23;
  uVar33 = uVar33 ^ uVar24;
  uVar36 = uVar33 << 6 | uVar33 >> 0x3a;
  uVar12 = uVar12 ^ uVar9;
  uVar12 = uVar12 << 0x19 | uVar12 >> 0x27;
  uVar38 = uVar38 ^ uVar19;
  uVar29 = uVar38 << 8 | uVar38 >> 0x38;
  uVar28 = (uVar23 | uVar3) ^ uVar28;
  uVar39 = uVar39 ^ uVar32;
  uVar33 = uVar39 << 0x12 | uVar39 >> 0x2e;
  uVar7 = ~uVar29;
  uVar23 = uVar33 & uVar7 ^ uVar12;
  uVar5 = uVar5 ^ uVar30;
  uVar3 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar5 = uVar12 & uVar29 ^ uVar36;
  uVar29 = uVar36 & uVar3 ^ uVar33;
  uVar12 = (uVar36 | uVar12) ^ uVar3;
  uVar21 = uVar21 ^ uVar32;
  uVar36 = uVar21 << 0x24 | uVar21 >> 0x1c;
  uVar7 = (uVar33 | uVar3) ^ uVar7;
  uVar1 = uVar1 ^ uVar30;
  uVar3 = uVar1 << 10 | uVar1 >> 0x36;
  uVar8 = uVar8 ^ uVar24;
  uVar1 = uVar8 << 0xf | uVar8 >> 0x31;
  uVar31 = (uVar3 | uVar1) ^ uVar36;
  uVar4 = uVar4 ^ uVar9;
  uVar33 = uVar4 << 0x38 | uVar4 >> 8;
  uVar1 = ~uVar1;
  uVar38 = (uVar33 | uVar1) ^ uVar3;
  uVar11 = uVar11 ^ uVar19;
  uVar4 = uVar11 << 0x1b | uVar11 >> 0x25;
  uVar21 = (uVar36 | uVar4) ^ uVar33;
  uVar34 = uVar36 & uVar3 ^ uVar4;
  uVar1 = uVar33 & uVar4 ^ uVar1;
  uVar24 = uVar24 ^ uVar16;
  uVar9 = uVar9 ^ uVar25;
  uVar19 = uVar19 ^ uVar15;
  uVar32 = uVar32 ^ uVar22;
  uVar30 = uVar30 ^ uVar18;
  uVar11 = uVar24 << 0x3e | uVar24 >> 2;
  uVar9 = uVar9 << 0x37 | uVar9 >> 9;
  uVar33 = uVar19 << 0x27 | uVar19 >> 0x19;
  uVar3 = uVar32 << 0x29 | uVar32 >> 0x17;
  uVar24 = uVar30 << 2 | uVar30 >> 0x3e;
  uVar36 = ~uVar9;
  uVar4 = (uVar24 | uVar11) ^ uVar3;
  uVar15 = uVar3 & uVar24 ^ uVar33;
  uVar32 = uVar33 & uVar36 ^ uVar11;
  uVar16 = uVar34 ^ uVar32 ^ uVar27 ^ uVar12 ^ uVar20;
  uVar36 = (uVar33 | uVar3) ^ uVar36;
  uVar39 = uVar1 ^ uVar4 ^ uVar10 ^ uVar28 ^ uVar7;
  uVar24 = uVar9 & uVar11 ^ uVar24;
  uVar3 = uVar5 ^ uVar31 ^ uVar6 ^ uVar26 ^ uVar36;
  uVar18 = uVar23 ^ uVar38 ^ uVar13 ^ uVar2 ^ uVar15;
  uVar33 = uVar29 ^ uVar21 ^ uVar14 ^ uVar17 ^ uVar24;
  uVar37 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar33;
  uVar30 = (uVar18 << 1 | (ulong)((long)uVar18 < 0)) ^ uVar16;
  uVar26 = uVar26 ^ uVar30;
  uVar9 = uVar26 << 0x2c | uVar26 >> 0x14;
  uVar3 = (uVar39 << 1 | (ulong)((long)uVar39 < 0)) ^ uVar3;
  uVar23 = uVar23 ^ uVar3;
  uVar11 = uVar23 << 0x2b | uVar23 >> 0x15;
  uVar18 = (uVar33 << 1 | (ulong)((long)uVar33 < 0)) ^ uVar18;
  uVar1 = uVar1 ^ uVar18;
  uVar33 = uVar1 << 0x15 | uVar1 >> 0x2b;
  uVar39 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar39;
  uVar24 = uVar24 ^ uVar39;
  uVar1 = uVar24 << 0xe | uVar24 >> 0x32;
  uVar20 = uVar20 ^ uVar37;
  uVar19 = uVar33 & uVar1 ^ uVar11;
  uVar22 = (~uVar11 | uVar33) ^ uVar9;
  uVar8 = uVar9 & uVar20 ^ uVar1;
  uVar10 = uVar10 ^ uVar18;
  uVar25 = uVar10 << 0x1c | uVar10 >> 0x24;
  uVar17 = uVar17 ^ uVar39;
  uVar23 = uVar17 << 0x14 | uVar17 >> 0x2c;
  uVar12 = uVar12 ^ uVar37;
  uVar12 = uVar12 << 3 | uVar12 >> 0x3d;
  uVar31 = uVar31 ^ uVar30;
  uVar16 = uVar31 << 0x2d | uVar31 >> 0x13;
  uVar10 = uVar20 ^ 0x8000000080008081 ^ (uVar9 | uVar11);
  uVar15 = uVar15 ^ uVar3;
  uVar24 = uVar15 << 0x3d | uVar15 >> 3;
  uVar33 = (uVar1 | uVar20) ^ uVar33;
  uVar15 = (uVar23 | uVar12) ^ uVar25;
  uVar1 = (~uVar24 | uVar16) ^ uVar12;
  uVar11 = uVar12 & uVar16 ^ uVar23;
  uVar23 = uVar23 & uVar25 ^ uVar24;
  uVar2 = uVar2 ^ uVar3;
  uVar2 = uVar2 << 6 | uVar2 >> 0x3a;
  uVar7 = uVar7 ^ uVar18;
  uVar9 = uVar7 << 0x19 | uVar7 >> 0x27;
  uVar21 = uVar21 ^ uVar39;
  uVar21 = uVar21 << 8 | uVar21 >> 0x38;
  uVar16 = (uVar24 | uVar25) ^ uVar16;
  uVar32 = uVar32 ^ uVar37;
  uVar17 = uVar32 << 0x12 | uVar32 >> 0x2e;
  uVar24 = ~uVar21;
  uVar7 = uVar17 & uVar24 ^ uVar9;
  uVar6 = uVar6 ^ uVar30;
  uVar6 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar31 = uVar9 & uVar21 ^ uVar2;
  uVar21 = uVar2 & uVar6 ^ uVar17;
  uVar12 = (uVar2 | uVar9) ^ uVar6;
  uVar14 = uVar14 ^ uVar39;
  uVar25 = uVar14 << 0x1b | uVar14 >> 0x25;
  uVar24 = (uVar17 | uVar6) ^ uVar24;
  uVar27 = uVar27 ^ uVar37;
  uVar6 = uVar27 << 0x24 | uVar27 >> 0x1c;
  uVar5 = uVar5 ^ uVar30;
  uVar2 = uVar5 << 10 | uVar5 >> 0x36;
  uVar5 = uVar6 & uVar2 ^ uVar25;
  uVar38 = uVar38 ^ uVar3;
  uVar38 = uVar38 << 0xf | uVar38 >> 0x31;
  uVar4 = uVar4 ^ uVar18;
  uVar27 = uVar4 << 0x38 | uVar4 >> 8;
  uVar4 = (uVar2 | uVar38) ^ uVar6;
  uVar38 = ~uVar38;
  uVar2 = (uVar27 | uVar38) ^ uVar2;
  uVar9 = (uVar6 | uVar25) ^ uVar27;
  uVar38 = uVar27 & uVar25 ^ uVar38;
  uVar3 = uVar3 ^ uVar13;
  uVar18 = uVar18 ^ uVar28;
  uVar39 = uVar39 ^ uVar29;
  uVar37 = uVar37 ^ uVar34;
  uVar30 = uVar30 ^ uVar36;
  uVar27 = uVar3 << 0x3e | uVar3 >> 2;
  uVar29 = uVar18 << 0x37 | uVar18 >> 9;
  uVar3 = uVar39 << 0x27 | uVar39 >> 0x19;
  uVar28 = uVar37 << 0x29 | uVar37 >> 0x17;
  uVar39 = uVar30 << 2 | uVar30 >> 0x3e;
  uVar36 = ~uVar29;
  uVar6 = (uVar39 | uVar27) ^ uVar28;
  uVar13 = uVar28 & uVar39 ^ uVar3;
  uVar32 = (uVar3 | uVar28) ^ uVar36;
  uVar30 = uVar3 & uVar36 ^ uVar27;
  uVar39 = uVar29 & uVar27 ^ uVar39;
  uVar29 = uVar12 ^ uVar5 ^ uVar10 ^ uVar15 ^ uVar30;
  uVar18 = uVar31 ^ uVar4 ^ uVar22 ^ uVar11 ^ uVar32;
  uVar3 = uVar7 ^ uVar2 ^ uVar19 ^ uVar1 ^ uVar13;
  uVar26 = uVar24 ^ uVar38 ^ uVar33 ^ uVar16 ^ uVar6;
  uVar27 = uVar21 ^ uVar9 ^ uVar8 ^ uVar23 ^ uVar39;
  uVar34 = (uVar18 << 1 | (ulong)((long)uVar18 < 0)) ^ uVar27;
  uVar14 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar29;
  uVar18 = (uVar26 << 1 | (ulong)((long)uVar26 < 0)) ^ uVar18;
  uVar11 = uVar11 ^ uVar14;
  uVar36 = uVar11 << 0x2c | uVar11 >> 0x14;
  uVar3 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar3;
  uVar7 = uVar7 ^ uVar18;
  uVar27 = uVar7 << 0x2b | uVar7 >> 0x15;
  uVar26 = (uVar29 << 1 | (ulong)((long)uVar29 < 0)) ^ uVar26;
  uVar38 = uVar38 ^ uVar3;
  uVar20 = uVar38 << 0x15 | uVar38 >> 0x2b;
  uVar10 = uVar10 ^ uVar34;
  uVar39 = uVar39 ^ uVar26;
  uVar11 = uVar39 << 0xe | uVar39 >> 0x32;
  uVar17 = uVar10 ^ 0x8000000000008009 ^ (uVar36 | uVar27);
  uVar38 = uVar20 & uVar11 ^ uVar27;
  uVar39 = (~uVar27 | uVar20) ^ uVar36;
  uVar33 = uVar33 ^ uVar3;
  uVar29 = uVar33 << 0x1c | uVar33 >> 0x24;
  uVar28 = uVar36 & uVar10 ^ uVar11;
  uVar23 = uVar23 ^ uVar26;
  uVar27 = uVar23 << 0x14 | uVar23 >> 0x2c;
  uVar12 = uVar12 ^ uVar34;
  uVar36 = uVar12 << 3 | uVar12 >> 0x3d;
  uVar4 = uVar4 ^ uVar14;
  uVar25 = uVar4 << 0x2d | uVar4 >> 0x13;
  uVar20 = (uVar11 | uVar10) ^ uVar20;
  uVar13 = uVar13 ^ uVar18;
  uVar11 = uVar13 << 0x3d | uVar13 >> 3;
  uVar4 = (uVar27 | uVar36) ^ uVar29;
  uVar10 = (~uVar11 | uVar25) ^ uVar36;
  uVar36 = uVar36 & uVar25 ^ uVar27;
  uVar7 = uVar27 & uVar29 ^ uVar11;
  uVar1 = uVar1 ^ uVar18;
  uVar27 = uVar1 << 6 | uVar1 >> 0x3a;
  uVar24 = uVar24 ^ uVar3;
  uVar23 = uVar24 << 0x19 | uVar24 >> 0x27;
  uVar25 = (uVar11 | uVar29) ^ uVar25;
  uVar9 = uVar9 ^ uVar26;
  uVar11 = uVar9 << 8 | uVar9 >> 0x38;
  uVar30 = uVar30 ^ uVar34;
  uVar24 = uVar30 << 0x12 | uVar30 >> 0x2e;
  uVar1 = ~uVar11;
  uVar29 = uVar24 & uVar1 ^ uVar23;
  uVar22 = uVar22 ^ uVar14;
  uVar33 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar12 = uVar23 & uVar11 ^ uVar27;
  uVar13 = uVar27 & uVar33 ^ uVar24;
  uVar30 = (uVar27 | uVar23) ^ uVar33;
  uVar1 = (uVar24 | uVar33) ^ uVar1;
  uVar8 = uVar8 ^ uVar26;
  uVar33 = uVar8 << 0x1b | uVar8 >> 0x25;
  uVar15 = uVar15 ^ uVar34;
  uVar15 = uVar15 << 0x24 | uVar15 >> 0x1c;
  uVar31 = uVar31 ^ uVar14;
  uVar27 = uVar31 << 10 | uVar31 >> 0x36;
  uVar2 = uVar2 ^ uVar18;
  uVar2 = uVar2 << 0xf | uVar2 >> 0x31;
  uVar31 = uVar15 & uVar27 ^ uVar33;
  uVar6 = uVar6 ^ uVar3;
  uVar11 = uVar6 << 0x38 | uVar6 >> 8;
  uVar23 = ~uVar2;
  uVar24 = (uVar11 | uVar23) ^ uVar27;
  uVar27 = (uVar27 | uVar2) ^ uVar15;
  uVar15 = (uVar15 | uVar33) ^ uVar11;
  uVar23 = uVar11 & uVar33 ^ uVar23;
  uVar18 = uVar18 ^ uVar19;
  uVar3 = uVar3 ^ uVar16;
  uVar26 = uVar26 ^ uVar21;
  uVar34 = uVar34 ^ uVar5;
  uVar14 = uVar14 ^ uVar32;
  uVar33 = uVar18 << 0x3e | uVar18 >> 2;
  uVar11 = uVar3 << 0x37 | uVar3 >> 9;
  uVar5 = uVar26 << 0x27 | uVar26 >> 0x19;
  uVar16 = uVar34 << 0x29 | uVar34 >> 0x17;
  uVar2 = uVar14 << 2 | uVar14 >> 0x3e;
  uVar21 = ~uVar11;
  uVar3 = (uVar2 | uVar33) ^ uVar16;
  uVar19 = uVar16 & uVar2 ^ uVar5;
  uVar16 = (uVar5 | uVar16) ^ uVar21;
  uVar6 = uVar27 ^ uVar16 ^ uVar36 ^ uVar12 ^ uVar39;
  uVar9 = uVar5 & uVar21 ^ uVar33;
  uVar2 = uVar11 & uVar33 ^ uVar2;
  uVar11 = uVar30 ^ uVar31 ^ uVar17 ^ uVar4 ^ uVar9;
  uVar34 = uVar29 ^ uVar24 ^ uVar38 ^ uVar10 ^ uVar19;
  uVar8 = uVar1 ^ uVar23 ^ uVar20 ^ uVar25 ^ uVar3;
  uVar21 = uVar13 ^ uVar15 ^ uVar28 ^ uVar7 ^ uVar2;
  uVar5 = (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar6;
  uVar32 = (uVar6 << 1 | (ulong)((long)uVar6 < 0)) ^ uVar21;
  uVar33 = (uVar34 << 1 | (ulong)((long)uVar34 < 0)) ^ uVar11;
  uVar34 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar34;
  uVar36 = uVar36 ^ uVar33;
  uVar22 = uVar36 << 0x2c | uVar36 >> 0x14;
  uVar8 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar8;
  uVar29 = uVar29 ^ uVar5;
  uVar36 = uVar29 << 0x2b | uVar29 >> 0x15;
  uVar17 = uVar17 ^ uVar32;
  uVar23 = uVar23 ^ uVar34;
  uVar23 = uVar23 << 0x15 | uVar23 >> 0x2b;
  uVar2 = uVar2 ^ uVar8;
  uVar11 = uVar2 << 0xe | uVar2 >> 0x32;
  uVar14 = uVar23 & uVar11 ^ uVar36;
  uVar29 = (~uVar36 | uVar23) ^ uVar22;
  uVar20 = uVar20 ^ uVar34;
  uVar20 = uVar20 << 0x1c | uVar20 >> 0x24;
  uVar7 = uVar7 ^ uVar8;
  uVar6 = uVar7 << 0x14 | uVar7 >> 0x2c;
  uVar26 = uVar22 & uVar17 ^ uVar11;
  uVar30 = uVar30 ^ uVar32;
  uVar21 = uVar30 << 3 | uVar30 >> 0x3d;
  uVar27 = uVar27 ^ uVar33;
  uVar18 = uVar27 << 0x2d | uVar27 >> 0x13;
  uVar19 = uVar19 ^ uVar5;
  uVar7 = uVar19 << 0x3d | uVar19 >> 3;
  uVar23 = (uVar11 | uVar17) ^ uVar23;
  uVar27 = (uVar6 | uVar21) ^ uVar20;
  uVar2 = (~uVar7 | uVar18) ^ uVar21;
  uVar21 = uVar21 & uVar18 ^ uVar6;
  uVar6 = uVar6 & uVar20 ^ uVar7;
  uVar10 = uVar10 ^ uVar5;
  uVar10 = uVar10 << 6 | uVar10 >> 0x3a;
  uVar1 = uVar1 ^ uVar34;
  uVar19 = uVar1 << 0x19 | uVar1 >> 0x27;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 << 8 | uVar15 >> 0x38;
  uVar18 = (uVar7 | uVar20) ^ uVar18;
  uVar9 = uVar9 ^ uVar32;
  uVar7 = uVar9 << 0x12 | uVar9 >> 0x2e;
  uVar11 = ~uVar15;
  uVar37 = uVar7 & uVar11 ^ uVar19;
  uVar39 = uVar39 ^ uVar33;
  uVar9 = uVar39 << 1 | (ulong)((long)uVar39 < 0);
  uVar30 = uVar19 & uVar15 ^ uVar10;
  uVar1 = uVar10 & uVar9 ^ uVar7;
  uVar20 = (uVar10 | uVar19) ^ uVar9;
  uVar4 = uVar4 ^ uVar32;
  uVar19 = uVar4 << 0x24 | uVar4 >> 0x1c;
  uVar11 = (uVar7 | uVar9) ^ uVar11;
  uVar12 = uVar12 ^ uVar33;
  uVar15 = uVar12 << 10 | uVar12 >> 0x36;
  uVar24 = uVar24 ^ uVar5;
  uVar4 = uVar24 << 0xf | uVar24 >> 0x31;
  uVar35 = (uVar15 | uVar4) ^ uVar19;
  uVar3 = uVar3 ^ uVar34;
  uVar10 = uVar3 << 0x38 | uVar3 >> 8;
  uVar4 = ~uVar4;
  uVar39 = (uVar10 | uVar4) ^ uVar15;
  uVar28 = uVar28 ^ uVar8;
  uVar24 = uVar28 << 0x1b | uVar28 >> 0x25;
  uVar3 = (uVar19 | uVar24) ^ uVar10;
  uVar19 = uVar19 & uVar15 ^ uVar24;
  uVar4 = uVar10 & uVar24 ^ uVar4;
  uVar5 = uVar5 ^ uVar38;
  uVar34 = uVar34 ^ uVar25;
  uVar8 = uVar8 ^ uVar13;
  uVar32 = uVar32 ^ uVar31;
  uVar33 = uVar33 ^ uVar16;
  uVar24 = uVar5 << 0x3e | uVar5 >> 2;
  uVar38 = uVar34 << 0x37 | uVar34 >> 9;
  uVar5 = uVar8 << 0x27 | uVar8 >> 0x19;
  uVar16 = uVar32 << 0x29 | uVar32 >> 0x17;
  uVar10 = uVar33 << 2 | uVar33 >> 0x3e;
  uVar33 = ~uVar38;
  uVar9 = (uVar10 | uVar24) ^ uVar16;
  uVar15 = uVar16 & uVar10 ^ uVar5;
  uVar32 = (uVar5 | uVar16) ^ uVar33;
  uVar12 = uVar4 ^ uVar9 ^ uVar23 ^ uVar18 ^ uVar11;
  uVar25 = uVar5 & uVar33 ^ uVar24;
  uVar10 = uVar38 & uVar24 ^ uVar10;
  uVar28 = (uVar22 | uVar36) ^ uVar17 ^ 0x8a;
  uVar24 = uVar27 ^ uVar20 ^ uVar19 ^ uVar28 ^ uVar25;
  uVar13 = uVar30 ^ uVar35 ^ uVar29 ^ uVar21 ^ uVar32;
  uVar5 = uVar37 ^ uVar39 ^ uVar14 ^ uVar2 ^ uVar15;
  uVar16 = uVar1 ^ uVar3 ^ uVar26 ^ uVar6 ^ uVar10;
  uVar33 = (uVar13 << 1 | (ulong)((long)uVar13 < 0)) ^ uVar16;
  uVar31 = (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^ uVar24;
  uVar13 = (uVar12 << 1 | (ulong)((long)uVar12 < 0)) ^ uVar13;
  uVar21 = uVar21 ^ uVar31;
  uVar36 = uVar21 << 0x2c | uVar21 >> 0x14;
  uVar5 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar5;
  uVar37 = uVar37 ^ uVar13;
  uVar16 = uVar37 << 0x2b | uVar37 >> 0x15;
  uVar12 = (uVar24 << 1 | (ulong)((long)uVar24 < 0)) ^ uVar12;
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 << 0x15 | uVar4 >> 0x2b;
  uVar28 = uVar28 ^ uVar33;
  uVar10 = uVar10 ^ uVar12;
  uVar8 = uVar10 << 0xe | uVar10 >> 0x32;
  uVar22 = uVar4 & uVar8 ^ uVar16;
  uVar7 = (~uVar16 | uVar4) ^ uVar36;
  uVar38 = uVar36 & uVar28 ^ uVar8;
  uVar23 = uVar23 ^ uVar5;
  uVar17 = uVar23 << 0x1c | uVar23 >> 0x24;
  uVar6 = uVar6 ^ uVar12;
  uVar21 = uVar6 << 0x14 | uVar6 >> 0x2c;
  uVar20 = uVar20 ^ uVar33;
  uVar10 = uVar20 << 3 | uVar20 >> 0x3d;
  uVar34 = uVar28 ^ 0x88 ^ (uVar36 | uVar16);
  uVar35 = uVar35 ^ uVar31;
  uVar24 = uVar35 << 0x2d | uVar35 >> 0x13;
  uVar4 = (uVar8 | uVar28) ^ uVar4;
  uVar15 = uVar15 ^ uVar13;
  uVar23 = uVar15 << 0x3d | uVar15 >> 3;
  uVar8 = (uVar21 | uVar10) ^ uVar17;
  uVar36 = (~uVar23 | uVar24) ^ uVar10;
  uVar10 = uVar10 & uVar24 ^ uVar21;
  uVar6 = uVar21 & uVar17 ^ uVar23;
  uVar2 = uVar2 ^ uVar13;
  uVar15 = uVar2 << 6 | uVar2 >> 0x3a;
  uVar11 = uVar11 ^ uVar5;
  uVar21 = uVar11 << 0x19 | uVar11 >> 0x27;
  uVar24 = (uVar23 | uVar17) ^ uVar24;
  uVar3 = uVar3 ^ uVar12;
  uVar11 = uVar3 << 8 | uVar3 >> 0x38;
  uVar25 = uVar25 ^ uVar33;
  uVar3 = uVar25 << 0x12 | uVar25 >> 0x2e;
  uVar2 = ~uVar11;
  uVar28 = uVar3 & uVar2 ^ uVar21;
  uVar29 = uVar29 ^ uVar31;
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  uVar25 = uVar21 & uVar11 ^ uVar15;
  uVar40 = uVar15 & uVar29 ^ uVar3;
  uVar11 = (uVar15 | uVar21) ^ uVar29;
  uVar2 = (uVar3 | uVar29) ^ uVar2;
  uVar26 = uVar26 ^ uVar12;
  uVar3 = uVar26 << 0x1b | uVar26 >> 0x25;
  uVar27 = uVar27 ^ uVar33;
  uVar29 = uVar27 << 0x24 | uVar27 >> 0x1c;
  uVar30 = uVar30 ^ uVar31;
  uVar27 = uVar30 << 10 | uVar30 >> 0x36;
  uVar17 = uVar29 & uVar27 ^ uVar3;
  uVar39 = uVar39 ^ uVar13;
  uVar39 = uVar39 << 0xf | uVar39 >> 0x31;
  uVar16 = (uVar27 | uVar39) ^ uVar29;
  uVar9 = uVar9 ^ uVar5;
  uVar15 = uVar9 << 0x38 | uVar9 >> 8;
  uVar39 = ~uVar39;
  uVar27 = (uVar15 | uVar39) ^ uVar27;
  uVar21 = (uVar29 | uVar3) ^ uVar15;
  uVar39 = uVar15 & uVar3 ^ uVar39;
  uVar13 = uVar13 ^ uVar14;
  uVar5 = uVar5 ^ uVar18;
  uVar12 = uVar12 ^ uVar1;
  uVar33 = uVar33 ^ uVar19;
  uVar31 = uVar31 ^ uVar32;
  uVar9 = uVar13 << 0x3e | uVar13 >> 2;
  uVar1 = uVar5 << 0x37 | uVar5 >> 9;
  uVar5 = uVar12 << 0x27 | uVar12 >> 0x19;
  uVar33 = uVar33 << 0x29 | uVar33 >> 0x17;
  uVar15 = uVar31 << 2 | uVar31 >> 0x3e;
  uVar29 = ~uVar1;
  uVar3 = (uVar15 | uVar9) ^ uVar33;
  uVar23 = uVar33 & uVar15 ^ uVar5;
  uVar31 = (uVar5 | uVar33) ^ uVar29;
  uVar30 = uVar27 ^ uVar23 ^ uVar22 ^ uVar36 ^ uVar28;
  uVar12 = uVar5 & uVar29 ^ uVar9;
  uVar15 = uVar1 & uVar9 ^ uVar15;
  uVar33 = uVar11 ^ uVar17 ^ uVar34 ^ uVar8 ^ uVar12;
  uVar1 = uVar25 ^ uVar16 ^ uVar7 ^ uVar10 ^ uVar31;
  uVar20 = uVar2 ^ uVar39 ^ uVar4 ^ uVar24 ^ uVar3;
  uVar5 = uVar40 ^ uVar21 ^ uVar38 ^ uVar6 ^ uVar15;
  uVar29 = (uVar20 << 1 | (ulong)((long)uVar20 < 0)) ^ uVar1;
  uVar19 = (uVar1 << 1 | (ulong)((long)uVar1 < 0)) ^ uVar5;
  uVar14 = (uVar30 << 1 | (ulong)((long)uVar30 < 0)) ^ uVar33;
  uVar30 = (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^ uVar30;
  uVar10 = uVar10 ^ uVar14;
  uVar5 = uVar10 << 0x2c | uVar10 >> 0x14;
  uVar20 = (uVar33 << 1 | (ulong)((long)uVar33 < 0)) ^ uVar20;
  uVar28 = uVar28 ^ uVar29;
  uVar1 = uVar28 << 0x2b | uVar28 >> 0x15;
  uVar34 = uVar34 ^ uVar19;
  uVar39 = uVar39 ^ uVar30;
  uVar32 = uVar39 << 0x15 | uVar39 >> 0x2b;
  uVar10 = uVar34 ^ 0x80008009 ^ (uVar5 | uVar1);
  uVar15 = uVar15 ^ uVar20;
  uVar15 = uVar15 << 0xe | uVar15 >> 0x32;
  uVar26 = uVar32 & uVar15 ^ uVar1;
  uVar9 = (~uVar1 | uVar32) ^ uVar5;
  uVar18 = uVar5 & uVar34 ^ uVar15;
  uVar4 = uVar4 ^ uVar30;
  uVar39 = uVar4 << 0x1c | uVar4 >> 0x24;
  uVar6 = uVar6 ^ uVar20;
  uVar1 = uVar6 << 0x14 | uVar6 >> 0x2c;
  uVar11 = uVar11 ^ uVar19;
  uVar4 = uVar11 << 3 | uVar11 >> 0x3d;
  uVar32 = (uVar15 | uVar34) ^ uVar32;
  uVar16 = uVar16 ^ uVar14;
  uVar34 = uVar16 << 0x2d | uVar16 >> 0x13;
  uVar23 = uVar23 ^ uVar29;
  uVar15 = uVar23 << 0x3d | uVar23 >> 3;
  uVar33 = (uVar1 | uVar4) ^ uVar39;
  uVar6 = (~uVar15 | uVar34) ^ uVar4;
  uVar4 = uVar4 & uVar34 ^ uVar1;
  uVar7 = uVar7 ^ uVar14;
  uVar5 = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar36 = uVar36 ^ uVar29;
  uVar23 = uVar36 << 6 | uVar36 >> 0x3a;
  uVar1 = uVar1 & uVar39 ^ uVar15;
  uVar2 = uVar2 ^ uVar30;
  uVar36 = uVar2 << 0x19 | uVar2 >> 0x27;
  uVar21 = uVar21 ^ uVar20;
  uVar11 = uVar21 << 8 | uVar21 >> 0x38;
  uVar12 = uVar12 ^ uVar19;
  uVar21 = uVar12 << 0x12 | uVar12 >> 0x2e;
  uVar34 = (uVar15 | uVar39) ^ uVar34;
  uVar2 = ~uVar11;
  uVar35 = uVar21 & uVar2 ^ uVar36;
  uVar13 = uVar36 & uVar11 ^ uVar23;
  uVar16 = uVar23 & uVar5 ^ uVar21;
  uVar23 = (uVar23 | uVar36) ^ uVar5;
  uVar2 = (uVar21 | uVar5) ^ uVar2;
  uVar38 = uVar38 ^ uVar20;
  uVar36 = uVar38 << 0x1b | uVar38 >> 0x25;
  uVar8 = uVar8 ^ uVar19;
  uVar11 = uVar8 << 0x24 | uVar8 >> 0x1c;
  uVar25 = uVar25 ^ uVar14;
  uVar5 = uVar25 << 10 | uVar25 >> 0x36;
  uVar37 = uVar11 & uVar5 ^ uVar36;
  uVar27 = uVar27 ^ uVar29;
  uVar15 = uVar27 << 0xf | uVar27 >> 0x31;
  uVar3 = uVar3 ^ uVar30;
  uVar3 = uVar3 << 0x38 | uVar3 >> 8;
  uVar21 = ~uVar15;
  uVar27 = (uVar3 | uVar21) ^ uVar5;
  uVar28 = (uVar5 | uVar15) ^ uVar11;
  uVar11 = (uVar11 | uVar36) ^ uVar3;
  uVar21 = uVar3 & uVar36 ^ uVar21;
  uVar29 = uVar29 ^ uVar22;
  uVar30 = uVar30 ^ uVar24;
  uVar20 = uVar20 ^ uVar40;
  uVar19 = uVar19 ^ uVar17;
  uVar14 = uVar14 ^ uVar31;
  uVar3 = uVar29 << 0x3e | uVar29 >> 2;
  uVar7 = uVar30 << 0x37 | uVar30 >> 9;
  uVar38 = uVar20 << 0x27 | uVar20 >> 0x19;
  uVar36 = uVar19 << 0x29 | uVar19 >> 0x17;
  uVar24 = uVar14 << 2 | uVar14 >> 0x3e;
  uVar29 = ~uVar7;
  uVar8 = (uVar24 | uVar3) ^ uVar36;
  uVar5 = uVar36 & uVar24 ^ uVar38;
  uVar36 = (uVar38 | uVar36) ^ uVar29;
  uVar15 = uVar28 ^ uVar36 ^ uVar4 ^ uVar13 ^ uVar9;
  uVar14 = uVar38 & uVar29 ^ uVar3;
  uVar24 = uVar7 & uVar3 ^ uVar24;
  uVar7 = uVar35 ^ uVar27 ^ uVar26 ^ uVar6 ^ uVar5;
  uVar38 = uVar2 ^ uVar21 ^ uVar32 ^ uVar34 ^ uVar8;
  uVar29 = (uVar38 << 1 | (ulong)((long)uVar38 < 0)) ^ uVar15;
  uVar3 = uVar16 ^ uVar11 ^ uVar18 ^ uVar1 ^ uVar24;
  uVar39 = (uVar15 << 1 | (ulong)((long)uVar15 < 0)) ^ uVar3;
  uVar12 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar7;
  uVar15 = uVar23 ^ uVar37 ^ uVar10 ^ uVar33 ^ uVar14;
  uVar31 = (uVar7 << 1 | (ulong)((long)uVar7 < 0)) ^ uVar15;
  uVar38 = (uVar15 << 1 | (ulong)((long)uVar15 < 0)) ^ uVar38;
  uVar4 = uVar4 ^ uVar31;
  uVar3 = uVar4 << 0x2c | uVar4 >> 0x14;
  uVar10 = uVar10 ^ uVar39;
  uVar35 = uVar35 ^ uVar29;
  uVar25 = uVar35 << 0x2b | uVar35 >> 0x15;
  uVar4 = uVar10 ^ 0x8000000a ^ (uVar3 | uVar25);
  uVar21 = uVar21 ^ uVar12;
  uVar7 = uVar21 << 0x15 | uVar21 >> 0x2b;
  uVar24 = uVar24 ^ uVar38;
  uVar19 = uVar24 << 0xe | uVar24 >> 0x32;
  uVar15 = uVar7 & uVar19 ^ uVar25;
  uVar17 = (~uVar25 | uVar7) ^ uVar3;
  uVar24 = uVar3 & uVar10 ^ uVar19;
  uVar32 = uVar32 ^ uVar12;
  uVar25 = uVar32 << 0x1c | uVar32 >> 0x24;
  uVar1 = uVar1 ^ uVar38;
  uVar21 = uVar1 << 0x14 | uVar1 >> 0x2c;
  uVar7 = (uVar19 | uVar10) ^ uVar7;
  uVar23 = uVar23 ^ uVar39;
  uVar10 = uVar23 << 3 | uVar23 >> 0x3d;
  uVar28 = uVar28 ^ uVar31;
  uVar19 = uVar28 << 0x2d | uVar28 >> 0x13;
  uVar5 = uVar5 ^ uVar29;
  uVar28 = uVar5 << 0x3d | uVar5 >> 3;
  uVar5 = (uVar21 | uVar10) ^ uVar25;
  uVar1 = (~uVar28 | uVar19) ^ uVar10;
  uVar3 = uVar10 & uVar19 ^ uVar21;
  uVar6 = uVar6 ^ uVar29;
  uVar23 = uVar6 << 6 | uVar6 >> 0x3a;
  uVar10 = uVar21 & uVar25 ^ uVar28;
  uVar2 = uVar2 ^ uVar12;
  uVar20 = uVar2 << 0x19 | uVar2 >> 0x27;
  uVar11 = uVar11 ^ uVar38;
  uVar11 = uVar11 << 8 | uVar11 >> 0x38;
  uVar14 = uVar14 ^ uVar39;
  uVar14 = uVar14 << 0x12 | uVar14 >> 0x2e;
  uVar19 = (uVar28 | uVar25) ^ uVar19;
  uVar2 = ~uVar11;
  uVar30 = uVar14 & uVar2 ^ uVar20;
  uVar9 = uVar9 ^ uVar31;
  uVar21 = uVar9 << 1 | (ulong)((long)uVar9 < 0);
  uVar28 = uVar20 & uVar11 ^ uVar23;
  uVar6 = uVar23 & uVar21 ^ uVar14;
  uVar25 = (uVar23 | uVar20) ^ uVar21;
  uVar2 = (uVar14 | uVar21) ^ uVar2;
  uVar33 = uVar33 ^ uVar39;
  uVar11 = uVar33 << 0x24 | uVar33 >> 0x1c;
  uVar13 = uVar13 ^ uVar31;
  uVar9 = uVar13 << 10 | uVar13 >> 0x36;
  uVar27 = uVar27 ^ uVar29;
  uVar13 = uVar27 << 0xf | uVar27 >> 0x31;
  uVar33 = (uVar9 | uVar13) ^ uVar11;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x38 | uVar8 >> 8;
  uVar13 = ~uVar13;
  uVar23 = (uVar8 | uVar13) ^ uVar9;
  uVar18 = uVar18 ^ uVar38;
  uVar27 = uVar18 << 0x1b | uVar18 >> 0x25;
  uVar21 = (uVar11 | uVar27) ^ uVar8;
  uVar32 = uVar11 & uVar9 ^ uVar27;
  uVar13 = uVar8 & uVar27 ^ uVar13;
  uVar29 = uVar29 ^ uVar26;
  uVar12 = uVar12 ^ uVar34;
  uVar38 = uVar38 ^ uVar16;
  uVar39 = uVar39 ^ uVar37;
  uVar31 = uVar31 ^ uVar36;
  uVar14 = uVar29 << 0x3e | uVar29 >> 2;
  uVar29 = uVar12 << 0x37 | uVar12 >> 9;
  uVar27 = uVar38 << 0x27 | uVar38 >> 0x19;
  uVar36 = uVar39 << 0x29 | uVar39 >> 0x17;
  uVar38 = uVar31 << 2 | uVar31 >> 0x3e;
  uVar39 = ~uVar29;
  uVar16 = (uVar38 | uVar14) ^ uVar36;
  uVar11 = uVar36 & uVar38 ^ uVar27;
  uVar18 = uVar27 & uVar39 ^ uVar14;
  uVar8 = uVar32 ^ uVar18 ^ uVar5 ^ uVar25 ^ uVar4;
  uVar39 = (uVar27 | uVar36) ^ uVar39;
  uVar9 = uVar13 ^ uVar16 ^ uVar7 ^ uVar19 ^ uVar2;
  uVar38 = uVar29 & uVar14 ^ uVar38;
  uVar27 = uVar28 ^ uVar33 ^ uVar17 ^ uVar3 ^ uVar39;
  uVar36 = uVar30 ^ uVar23 ^ uVar15 ^ uVar1 ^ uVar11;
  uVar29 = (uVar9 << 1 | (ulong)((long)uVar9 < 0)) ^ uVar27;
  uVar12 = uVar6 ^ uVar21 ^ uVar24 ^ uVar10 ^ uVar38;
  uVar22 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar12;
  uVar14 = (uVar12 << 1 | (ulong)((long)uVar12 < 0)) ^ uVar36;
  uVar20 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar8;
  uVar9 = (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar9;
  uVar4 = uVar4 ^ uVar22;
  uVar3 = uVar3 ^ uVar20;
  uVar36 = uVar3 << 0x2c | uVar3 >> 0x14;
  uVar30 = uVar30 ^ uVar29;
  uVar12 = uVar30 << 0x2b | uVar30 >> 0x15;
  uVar27 = uVar4 ^ 0x8000808b ^ (uVar36 | uVar12);
  uVar13 = uVar13 ^ uVar14;
  uVar8 = uVar13 << 0x15 | uVar13 >> 0x2b;
  uVar38 = uVar38 ^ uVar9;
  uVar3 = uVar38 << 0xe | uVar38 >> 0x32;
  uVar13 = uVar8 & uVar3 ^ uVar12;
  uVar31 = (~uVar12 | uVar8) ^ uVar36;
  uVar7 = uVar7 ^ uVar14;
  uVar7 = uVar7 << 0x1c | uVar7 >> 0x24;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 << 0x14 | uVar10 >> 0x2c;
  uVar12 = uVar36 & uVar4 ^ uVar3;
  uVar25 = uVar25 ^ uVar22;
  uVar25 = uVar25 << 3 | uVar25 >> 0x3d;
  uVar33 = uVar33 ^ uVar20;
  uVar36 = uVar33 << 0x2d | uVar33 >> 0x13;
  uVar11 = uVar11 ^ uVar29;
  uVar38 = uVar11 << 0x3d | uVar11 >> 3;
  uVar8 = (uVar3 | uVar4) ^ uVar8;
  uVar33 = (uVar10 | uVar25) ^ uVar7;
  uVar3 = (~uVar38 | uVar36) ^ uVar25;
  uVar25 = uVar25 & uVar36 ^ uVar10;
  uVar11 = uVar10 & uVar7 ^ uVar38;
  uVar1 = uVar1 ^ uVar29;
  uVar4 = uVar1 << 6 | uVar1 >> 0x3a;
  uVar2 = uVar2 ^ uVar14;
  uVar2 = uVar2 << 0x19 | uVar2 >> 0x27;
  uVar21 = uVar21 ^ uVar9;
  uVar10 = uVar21 << 8 | uVar21 >> 0x38;
  uVar36 = (uVar38 | uVar7) ^ uVar36;
  uVar18 = uVar18 ^ uVar22;
  uVar18 = uVar18 << 0x12 | uVar18 >> 0x2e;
  uVar21 = ~uVar10;
  uVar34 = uVar18 & uVar21 ^ uVar2;
  uVar17 = uVar17 ^ uVar20;
  uVar7 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
  uVar38 = uVar2 & uVar10 ^ uVar4;
  uVar17 = uVar4 & uVar7 ^ uVar18;
  uVar1 = (uVar4 | uVar2) ^ uVar7;
  uVar24 = uVar24 ^ uVar9;
  uVar10 = uVar24 << 0x1b | uVar24 >> 0x25;
  uVar21 = (uVar18 | uVar7) ^ uVar21;
  uVar5 = uVar5 ^ uVar22;
  uVar2 = uVar5 << 0x24 | uVar5 >> 0x1c;
  uVar28 = uVar28 ^ uVar20;
  uVar4 = uVar28 << 10 | uVar28 >> 0x36;
  uVar5 = uVar2 & uVar4 ^ uVar10;
  uVar23 = uVar23 ^ uVar29;
  uVar18 = uVar23 << 0xf | uVar23 >> 0x31;
  uVar16 = uVar16 ^ uVar14;
  uVar23 = uVar16 << 0x38 | uVar16 >> 8;
  uVar28 = (uVar4 | uVar18) ^ uVar2;
  uVar18 = ~uVar18;
  uVar4 = (uVar23 | uVar18) ^ uVar4;
  uVar2 = (uVar2 | uVar10) ^ uVar23;
  uVar18 = uVar23 & uVar10 ^ uVar18;
  uVar29 = uVar29 ^ uVar15;
  uVar14 = uVar14 ^ uVar19;
  uVar9 = uVar9 ^ uVar6;
  uVar22 = uVar22 ^ uVar32;
  uVar20 = uVar20 ^ uVar39;
  uVar10 = uVar29 << 0x3e | uVar29 >> 2;
  uVar23 = uVar14 << 0x37 | uVar14 >> 9;
  uVar6 = uVar9 << 0x27 | uVar9 >> 0x19;
  uVar24 = uVar22 << 0x29 | uVar22 >> 0x17;
  uVar16 = uVar20 << 2 | uVar20 >> 0x3e;
  uVar15 = ~uVar23;
  uVar29 = (uVar16 | uVar10) ^ uVar24;
  uVar20 = uVar24 & uVar16 ^ uVar6;
  uVar30 = (uVar6 | uVar24) ^ uVar15;
  uVar22 = uVar6 & uVar15 ^ uVar10;
  uVar16 = uVar23 & uVar10 ^ uVar16;
  uVar15 = uVar1 ^ uVar5 ^ uVar27 ^ uVar33 ^ uVar22;
  uVar32 = uVar38 ^ uVar28 ^ uVar31 ^ uVar25 ^ uVar30;
  uVar7 = uVar34 ^ uVar4 ^ uVar13 ^ uVar3 ^ uVar20;
  uVar24 = uVar21 ^ uVar18 ^ uVar8 ^ uVar36 ^ uVar29;
  uVar23 = uVar17 ^ uVar2 ^ uVar12 ^ uVar11 ^ uVar16;
  uVar10 = (uVar32 << 1 | (ulong)((long)uVar32 < 0)) ^ uVar23;
  uVar26 = (uVar7 << 1 | (ulong)((long)uVar7 < 0)) ^ uVar15;
  uVar32 = (uVar24 << 1 | (ulong)((long)uVar24 < 0)) ^ uVar32;
  uVar25 = uVar25 ^ uVar26;
  uVar6 = uVar25 << 0x2c | uVar25 >> 0x14;
  uVar7 = (uVar23 << 1 | (ulong)((long)uVar23 < 0)) ^ uVar7;
  uVar34 = uVar34 ^ uVar32;
  uVar23 = uVar34 << 0x2b | uVar34 >> 0x15;
  uVar24 = (uVar15 << 1 | (ulong)((long)uVar15 < 0)) ^ uVar24;
  uVar18 = uVar18 ^ uVar7;
  uVar14 = uVar18 << 0x15 | uVar18 >> 0x2b;
  uVar27 = uVar27 ^ uVar10;
  uVar16 = uVar16 ^ uVar24;
  uVar19 = uVar16 << 0xe | uVar16 >> 0x32;
  uVar39 = uVar27 ^ 0x800000000000008b ^ (uVar6 | uVar23);
  uVar16 = uVar14 & uVar19 ^ uVar23;
  uVar15 = (~uVar23 | uVar14) ^ uVar6;
  uVar8 = uVar8 ^ uVar7;
  uVar9 = uVar8 << 0x1c | uVar8 >> 0x24;
  uVar18 = uVar6 & uVar27 ^ uVar19;
  uVar11 = uVar11 ^ uVar24;
  uVar11 = uVar11 << 0x14 | uVar11 >> 0x2c;
  uVar1 = uVar1 ^ uVar10;
  uVar23 = uVar1 << 3 | uVar1 >> 0x3d;
  uVar28 = uVar28 ^ uVar26;
  uVar25 = uVar28 << 0x2d | uVar28 >> 0x13;
  uVar14 = (uVar19 | uVar27) ^ uVar14;
  uVar20 = uVar20 ^ uVar32;
  uVar8 = uVar20 << 0x3d | uVar20 >> 3;
  uVar1 = (uVar11 | uVar23) ^ uVar9;
  uVar27 = (~uVar8 | uVar25) ^ uVar23;
  uVar23 = uVar23 & uVar25 ^ uVar11;
  uVar6 = uVar11 & uVar9 ^ uVar8;
  uVar3 = uVar3 ^ uVar32;
  uVar11 = uVar3 << 6 | uVar3 >> 0x3a;
  uVar21 = uVar21 ^ uVar7;
  uVar28 = uVar21 << 0x19 | uVar21 >> 0x27;
  uVar25 = (uVar8 | uVar9) ^ uVar25;
  uVar2 = uVar2 ^ uVar24;
  uVar2 = uVar2 << 8 | uVar2 >> 0x38;
  uVar22 = uVar22 ^ uVar10;
  uVar20 = uVar22 << 0x12 | uVar22 >> 0x2e;
  uVar3 = ~uVar2;
  uVar19 = uVar20 & uVar3 ^ uVar28;
  uVar31 = uVar31 ^ uVar26;
  uVar21 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar8 = uVar28 & uVar2 ^ uVar11;
  uVar9 = uVar11 & uVar21 ^ uVar20;
  uVar11 = (uVar11 | uVar28) ^ uVar21;
  uVar3 = (uVar20 | uVar21) ^ uVar3;
  uVar12 = uVar12 ^ uVar24;
  uVar21 = uVar12 << 0x1b | uVar12 >> 0x25;
  uVar33 = uVar33 ^ uVar10;
  uVar33 = uVar33 << 0x24 | uVar33 >> 0x1c;
  uVar38 = uVar38 ^ uVar26;
  uVar12 = uVar38 << 10 | uVar38 >> 0x36;
  uVar4 = uVar4 ^ uVar32;
  uVar2 = uVar4 << 0xf | uVar4 >> 0x31;
  uVar38 = uVar33 & uVar12 ^ uVar21;
  uVar29 = uVar29 ^ uVar7;
  uVar29 = uVar29 << 0x38 | uVar29 >> 8;
  uVar28 = ~uVar2;
  uVar4 = (uVar29 | uVar28) ^ uVar12;
  uVar2 = (uVar12 | uVar2) ^ uVar33;
  uVar22 = (uVar33 | uVar21) ^ uVar29;
  uVar28 = uVar29 & uVar21 ^ uVar28;
  uVar32 = uVar32 ^ uVar13;
  uVar7 = uVar7 ^ uVar36;
  uVar24 = uVar24 ^ uVar17;
  uVar10 = uVar10 ^ uVar5;
  uVar26 = uVar26 ^ uVar30;
  uVar17 = uVar32 << 0x3e | uVar32 >> 2;
  uVar29 = uVar7 << 0x37 | uVar7 >> 9;
  uVar21 = uVar24 << 0x27 | uVar24 >> 0x19;
  uVar36 = uVar10 << 0x29 | uVar10 >> 0x17;
  uVar5 = uVar26 << 2 | uVar26 >> 0x3e;
  uVar10 = ~uVar29;
  uVar33 = (uVar5 | uVar17) ^ uVar36;
  uVar24 = uVar36 & uVar5 ^ uVar21;
  uVar36 = (uVar21 | uVar36) ^ uVar10;
  uVar12 = uVar2 ^ uVar36 ^ uVar23 ^ uVar8 ^ uVar15;
  uVar7 = uVar21 & uVar10 ^ uVar17;
  uVar5 = uVar29 & uVar17 ^ uVar5;
  uVar17 = uVar11 ^ uVar38 ^ uVar39 ^ uVar1 ^ uVar7;
  uVar32 = uVar19 ^ uVar4 ^ uVar16 ^ uVar27 ^ uVar24;
  uVar21 = uVar3 ^ uVar28 ^ uVar14 ^ uVar25 ^ uVar33;
  uVar10 = uVar9 ^ uVar22 ^ uVar18 ^ uVar6 ^ uVar5;
  uVar29 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar12;
  uVar20 = (uVar12 << 1 | (ulong)((long)uVar12 < 0)) ^ uVar10;
  uVar34 = (uVar32 << 1 | (ulong)((long)uVar32 < 0)) ^ uVar17;
  uVar32 = (uVar10 << 1 | (ulong)((long)uVar10 < 0)) ^ uVar32;
  uVar23 = uVar23 ^ uVar34;
  uVar10 = uVar23 << 0x2c | uVar23 >> 0x14;
  uVar21 = (uVar17 << 1 | (ulong)((long)uVar17 < 0)) ^ uVar21;
  uVar19 = uVar19 ^ uVar29;
  uVar17 = uVar19 << 0x2b | uVar19 >> 0x15;
  uVar39 = uVar39 ^ uVar20;
  uVar28 = uVar28 ^ uVar32;
  uVar12 = uVar28 << 0x15 | uVar28 >> 0x2b;
  uVar30 = uVar39 ^ 0x8000000000008089 ^ (uVar10 | uVar17);
  uVar5 = uVar5 ^ uVar21;
  uVar23 = uVar5 << 0xe | uVar5 >> 0x32;
  uVar19 = uVar12 & uVar23 ^ uVar17;
  uVar28 = (~uVar17 | uVar12) ^ uVar10;
  uVar13 = uVar10 & uVar39 ^ uVar23;
  uVar14 = uVar14 ^ uVar32;
  uVar17 = uVar14 << 0x1c | uVar14 >> 0x24;
  uVar6 = uVar6 ^ uVar21;
  uVar5 = uVar6 << 0x14 | uVar6 >> 0x2c;
  uVar11 = uVar11 ^ uVar20;
  uVar10 = uVar11 << 3 | uVar11 >> 0x3d;
  uVar12 = (uVar23 | uVar39) ^ uVar12;
  uVar2 = uVar2 ^ uVar34;
  uVar6 = uVar2 << 0x2d | uVar2 >> 0x13;
  uVar24 = uVar24 ^ uVar29;
  uVar2 = uVar24 << 0x3d | uVar24 >> 3;
  uVar31 = (uVar5 | uVar10) ^ uVar17;
  uVar11 = (~uVar2 | uVar6) ^ uVar10;
  uVar10 = uVar10 & uVar6 ^ uVar5;
  uVar15 = uVar15 ^ uVar34;
  uVar26 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
  uVar27 = uVar27 ^ uVar29;
  uVar23 = uVar27 << 6 | uVar27 >> 0x3a;
  uVar24 = uVar5 & uVar17 ^ uVar2;
  uVar3 = uVar3 ^ uVar32;
  uVar3 = uVar3 << 0x19 | uVar3 >> 0x27;
  uVar22 = uVar22 ^ uVar21;
  uVar27 = uVar22 << 8 | uVar22 >> 0x38;
  uVar7 = uVar7 ^ uVar20;
  uVar15 = uVar7 << 0x12 | uVar7 >> 0x2e;
  uVar6 = (uVar2 | uVar17) ^ uVar6;
  uVar17 = ~uVar27;
  uVar39 = uVar15 & uVar17 ^ uVar3;
  uVar27 = uVar3 & uVar27 ^ uVar23;
  uVar14 = uVar23 & uVar26 ^ uVar15;
  uVar7 = (uVar23 | uVar3) ^ uVar26;
  uVar17 = (uVar15 | uVar26) ^ uVar17;
  uVar1 = uVar1 ^ uVar20;
  uVar15 = uVar1 << 0x24 | uVar1 >> 0x1c;
  uVar8 = uVar8 ^ uVar34;
  uVar23 = uVar8 << 10 | uVar8 >> 0x36;
  uVar4 = uVar4 ^ uVar29;
  uVar4 = uVar4 << 0xf | uVar4 >> 0x31;
  uVar1 = (uVar23 | uVar4) ^ uVar15;
  uVar33 = uVar33 ^ uVar32;
  uVar3 = uVar33 << 0x38 | uVar33 >> 8;
  uVar4 = ~uVar4;
  uVar8 = (uVar3 | uVar4) ^ uVar23;
  uVar18 = uVar18 ^ uVar21;
  uVar33 = uVar18 << 0x1b | uVar18 >> 0x25;
  uVar2 = (uVar15 | uVar33) ^ uVar3;
  uVar22 = uVar15 & uVar23 ^ uVar33;
  uVar4 = uVar3 & uVar33 ^ uVar4;
  uVar29 = uVar29 ^ uVar16;
  uVar32 = uVar32 ^ uVar25;
  uVar21 = uVar21 ^ uVar9;
  uVar20 = uVar20 ^ uVar38;
  uVar34 = uVar34 ^ uVar36;
  uVar29 = uVar29 << 0x3e | uVar29 >> 2;
  uVar33 = uVar32 << 0x37 | uVar32 >> 9;
  uVar36 = uVar21 << 0x27 | uVar21 >> 0x19;
  uVar15 = uVar20 << 0x29 | uVar20 >> 0x17;
  uVar38 = uVar34 << 2 | uVar34 >> 0x3e;
  uVar23 = ~uVar33;
  uVar3 = (uVar38 | uVar29) ^ uVar15;
  uVar18 = uVar15 & uVar38 ^ uVar36;
  uVar32 = (uVar36 | uVar15) ^ uVar23;
  uVar21 = uVar4 ^ uVar3 ^ uVar12 ^ uVar6 ^ uVar17;
  uVar16 = uVar36 & uVar23 ^ uVar29;
  uVar38 = uVar33 & uVar29 ^ uVar38;
  uVar15 = uVar27 ^ uVar1 ^ uVar28 ^ uVar10 ^ uVar32;
  uVar29 = uVar39 ^ uVar8 ^ uVar19 ^ uVar11 ^ uVar18;
  uVar5 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar15;
  uVar36 = uVar14 ^ uVar2 ^ uVar13 ^ uVar24 ^ uVar38;
  uVar9 = (uVar15 << 1 | (ulong)((long)uVar15 < 0)) ^ uVar36;
  uVar25 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar29;
  uVar36 = uVar22 ^ uVar16 ^ uVar31 ^ uVar7 ^ uVar30;
  uVar23 = (uVar29 << 1 | (ulong)((long)uVar29 < 0)) ^ uVar36;
  uVar21 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar21;
  uVar10 = uVar10 ^ uVar23;
  uVar29 = uVar10 << 0x2c | uVar10 >> 0x14;
  uVar30 = uVar30 ^ uVar9;
  uVar39 = uVar39 ^ uVar5;
  uVar36 = uVar39 << 0x2b | uVar39 >> 0x15;
  uVar26 = uVar30 ^ 0x8000000000008003 ^ (uVar29 | uVar36);
  uVar4 = uVar4 ^ uVar25;
  uVar4 = uVar4 << 0x15 | uVar4 >> 0x2b;
  uVar38 = uVar38 ^ uVar21;
  uVar33 = uVar38 << 0xe | uVar38 >> 0x32;
  uVar34 = uVar4 & uVar33 ^ uVar36;
  uVar20 = (~uVar36 | uVar4) ^ uVar29;
  uVar38 = uVar29 & uVar30 ^ uVar33;
  uVar12 = uVar12 ^ uVar25;
  uVar15 = uVar12 << 0x1c | uVar12 >> 0x24;
  uVar24 = uVar24 ^ uVar21;
  uVar10 = uVar24 << 0x14 | uVar24 >> 0x2c;
  uVar4 = (uVar33 | uVar30) ^ uVar4;
  uVar7 = uVar7 ^ uVar9;
  uVar29 = uVar7 << 3 | uVar7 >> 0x3d;
  uVar1 = uVar1 ^ uVar23;
  uVar30 = uVar1 << 0x2d | uVar1 >> 0x13;
  uVar18 = uVar18 ^ uVar5;
  uVar24 = uVar18 << 0x3d | uVar18 >> 3;
  uVar36 = (uVar10 | uVar29) ^ uVar15;
  uVar33 = (~uVar24 | uVar30) ^ uVar29;
  uVar1 = uVar29 & uVar30 ^ uVar10;
  uVar11 = uVar11 ^ uVar5;
  uVar29 = uVar11 << 6 | uVar11 >> 0x3a;
  uVar11 = uVar10 & uVar15 ^ uVar24;
  uVar17 = uVar17 ^ uVar25;
  uVar7 = uVar17 << 0x19 | uVar17 >> 0x27;
  uVar2 = uVar2 ^ uVar21;
  uVar10 = uVar2 << 8 | uVar2 >> 0x38;
  uVar16 = uVar16 ^ uVar9;
  uVar16 = uVar16 << 0x12 | uVar16 >> 0x2e;
  uVar30 = (uVar24 | uVar15) ^ uVar30;
  uVar15 = ~uVar10;
  uVar35 = uVar16 & uVar15 ^ uVar7;
  uVar28 = uVar28 ^ uVar23;
  uVar2 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar37 = uVar7 & uVar10 ^ uVar29;
  uVar24 = uVar29 & uVar2 ^ uVar16;
  uVar18 = (uVar29 | uVar7) ^ uVar2;
  uVar15 = (uVar16 | uVar2) ^ uVar15;
  uVar13 = uVar13 ^ uVar21;
  uVar7 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar31 = uVar31 ^ uVar9;
  uVar29 = uVar31 << 0x24 | uVar31 >> 0x1c;
  uVar27 = uVar27 ^ uVar23;
  uVar2 = uVar27 << 10 | uVar27 >> 0x36;
  uVar16 = uVar29 & uVar2 ^ uVar7;
  uVar8 = uVar8 ^ uVar5;
  uVar39 = uVar8 << 0xf | uVar8 >> 0x31;
  uVar10 = (uVar2 | uVar39) ^ uVar29;
  uVar3 = uVar3 ^ uVar25;
  uVar27 = uVar3 << 0x38 | uVar3 >> 8;
  uVar39 = ~uVar39;
  uVar2 = (uVar27 | uVar39) ^ uVar2;
  uVar17 = (uVar29 | uVar7) ^ uVar27;
  uVar39 = uVar27 & uVar7 ^ uVar39;
  uVar5 = uVar5 ^ uVar19;
  uVar25 = uVar25 ^ uVar6;
  uVar21 = uVar21 ^ uVar14;
  uVar9 = uVar9 ^ uVar22;
  uVar23 = uVar23 ^ uVar32;
  uVar29 = uVar5 << 0x3e | uVar5 >> 2;
  uVar5 = uVar25 << 0x37 | uVar25 >> 9;
  uVar7 = uVar21 << 0x27 | uVar21 >> 0x19;
  uVar21 = uVar9 << 0x29 | uVar9 >> 0x17;
  uVar27 = uVar23 << 2 | uVar23 >> 0x3e;
  uVar3 = ~uVar5;
  uVar12 = (uVar27 | uVar29) ^ uVar21;
  uVar23 = uVar21 & uVar27 ^ uVar7;
  uVar6 = (uVar7 | uVar21) ^ uVar3;
  uVar13 = uVar7 & uVar3 ^ uVar29;
  uVar27 = uVar5 & uVar29 ^ uVar27;
  uVar7 = uVar18 ^ uVar16 ^ uVar26 ^ uVar36 ^ uVar13;
  uVar3 = uVar37 ^ uVar10 ^ uVar20 ^ uVar1 ^ uVar6;
  uVar29 = uVar35 ^ uVar2 ^ uVar34 ^ uVar33 ^ uVar23;
  uVar31 = uVar15 ^ uVar39 ^ uVar4 ^ uVar30 ^ uVar12;
  uVar9 = (uVar31 << 1 | (ulong)((long)uVar31 < 0)) ^ uVar3;
  uVar5 = uVar24 ^ uVar17 ^ uVar38 ^ uVar11 ^ uVar27;
  uVar21 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar5;
  uVar32 = (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^ uVar29;
  uVar28 = (uVar29 << 1 | (ulong)((long)uVar29 < 0)) ^ uVar7;
  uVar31 = (uVar7 << 1 | (ulong)((long)uVar7 < 0)) ^ uVar31;
  uVar26 = uVar26 ^ uVar21;
  uVar1 = uVar1 ^ uVar28;
  uVar29 = uVar1 << 0x2c | uVar1 >> 0x14;
  uVar35 = uVar35 ^ uVar9;
  uVar1 = uVar35 << 0x2b | uVar35 >> 0x15;
  uVar7 = uVar26 ^ 0x8000000000008002 ^ (uVar29 | uVar1);
  uVar39 = uVar39 ^ uVar32;
  uVar8 = uVar39 << 0x15 | uVar39 >> 0x2b;
  uVar27 = uVar27 ^ uVar31;
  uVar3 = uVar27 << 0xe | uVar27 >> 0x32;
  uVar27 = uVar8 & uVar3 ^ uVar1;
  uVar5 = (~uVar1 | uVar8) ^ uVar29;
  uVar4 = uVar4 ^ uVar32;
  uVar39 = uVar4 << 0x1c | uVar4 >> 0x24;
  uVar11 = uVar11 ^ uVar31;
  uVar4 = uVar11 << 0x14 | uVar11 >> 0x2c;
  uVar1 = uVar29 & uVar26 ^ uVar3;
  uVar18 = uVar18 ^ uVar21;
  uVar29 = uVar18 << 3 | uVar18 >> 0x3d;
  uVar10 = uVar10 ^ uVar28;
  uVar19 = uVar10 << 0x2d | uVar10 >> 0x13;
  uVar23 = uVar23 ^ uVar9;
  uVar10 = uVar23 << 0x3d | uVar23 >> 3;
  uVar8 = (uVar3 | uVar26) ^ uVar8;
  uVar3 = (uVar4 | uVar29) ^ uVar39;
  uVar11 = (~uVar10 | uVar19) ^ uVar29;
  uVar29 = uVar29 & uVar19 ^ uVar4;
  uVar25 = uVar4 & uVar39 ^ uVar10;
  uVar33 = uVar33 ^ uVar9;
  uVar4 = uVar33 << 6 | uVar33 >> 0x3a;
  uVar15 = uVar15 ^ uVar32;
  uVar15 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar17 = uVar17 ^ uVar31;
  uVar23 = uVar17 << 8 | uVar17 >> 0x38;
  uVar19 = (uVar10 | uVar39) ^ uVar19;
  uVar13 = uVar13 ^ uVar21;
  uVar17 = uVar13 << 0x12 | uVar13 >> 0x2e;
  uVar10 = ~uVar23;
  uVar26 = uVar17 & uVar10 ^ uVar15;
  uVar20 = uVar20 ^ uVar28;
  uVar33 = uVar20 << 1 | (ulong)((long)uVar20 < 0);
  uVar23 = uVar15 & uVar23 ^ uVar4;
  uVar14 = uVar4 & uVar33 ^ uVar17;
  uVar22 = (uVar4 | uVar15) ^ uVar33;
  uVar38 = uVar38 ^ uVar31;
  uVar39 = uVar38 << 0x1b | uVar38 >> 0x25;
  uVar10 = (uVar17 | uVar33) ^ uVar10;
  uVar36 = uVar36 ^ uVar21;
  uVar36 = uVar36 << 0x24 | uVar36 >> 0x1c;
  uVar37 = uVar37 ^ uVar28;
  uVar33 = uVar37 << 10 | uVar37 >> 0x36;
  uVar2 = uVar2 ^ uVar9;
  uVar15 = uVar2 << 0xf | uVar2 >> 0x31;
  uVar12 = uVar12 ^ uVar32;
  uVar4 = uVar12 << 0x38 | uVar12 >> 8;
  uVar17 = uVar36 & uVar33 ^ uVar39;
  uVar18 = ~uVar15;
  uVar13 = (uVar4 | uVar18) ^ uVar33;
  uVar38 = (uVar33 | uVar15) ^ uVar36;
  uVar2 = (uVar36 | uVar39) ^ uVar4;
  uVar18 = uVar4 & uVar39 ^ uVar18;
  uVar9 = uVar9 ^ uVar34;
  uVar32 = uVar32 ^ uVar30;
  uVar31 = uVar31 ^ uVar24;
  uVar21 = uVar21 ^ uVar16;
  uVar15 = uVar9 << 0x3e | uVar9 >> 2;
  uVar9 = uVar32 << 0x37 | uVar32 >> 9;
  uVar33 = uVar31 << 0x27 | uVar31 >> 0x19;
  uVar36 = uVar21 << 0x29 | uVar21 >> 0x17;
  uVar28 = uVar28 ^ uVar6;
  uVar21 = uVar28 << 2 | uVar28 >> 0x3e;
  uVar16 = ~uVar9;
  uVar4 = (uVar21 | uVar15) ^ uVar36;
  uVar24 = uVar36 & uVar21 ^ uVar33;
  uVar31 = (uVar33 | uVar36) ^ uVar16;
  uVar30 = uVar38 ^ uVar31 ^ uVar29 ^ uVar23 ^ uVar5;
  uVar20 = uVar33 & uVar16 ^ uVar15;
  uVar21 = uVar9 & uVar15 ^ uVar21;
  uVar15 = uVar22 ^ uVar17 ^ uVar7 ^ uVar3 ^ uVar20;
  uVar33 = uVar26 ^ uVar13 ^ uVar27 ^ uVar11 ^ uVar24;
  uVar39 = uVar10 ^ uVar18 ^ uVar8 ^ uVar19 ^ uVar4;
  uVar36 = uVar14 ^ uVar2 ^ uVar1 ^ uVar25 ^ uVar21;
  uVar12 = (uVar30 << 1 | (ulong)((long)uVar30 < 0)) ^ uVar36;
  uVar16 = (uVar33 << 1 | (ulong)((long)uVar33 < 0)) ^ uVar15;
  uVar30 = (uVar39 << 1 | (ulong)((long)uVar39 < 0)) ^ uVar30;
  uVar29 = uVar29 ^ uVar16;
  uVar29 = uVar29 << 0x2c | uVar29 >> 0x14;
  uVar33 = (uVar36 << 1 | (ulong)((long)uVar36 < 0)) ^ uVar33;
  uVar26 = uVar26 ^ uVar30;
  uVar6 = uVar26 << 0x2b | uVar26 >> 0x15;
  uVar39 = (uVar15 << 1 | (ulong)((long)uVar15 < 0)) ^ uVar39;
  uVar18 = uVar18 ^ uVar33;
  uVar34 = uVar18 << 0x15 | uVar18 >> 0x2b;
  uVar7 = uVar7 ^ uVar12;
  uVar21 = uVar21 ^ uVar39;
  uVar15 = uVar21 << 0xe | uVar21 >> 0x32;
  uVar32 = uVar34 & uVar15 ^ uVar6;
  uVar36 = (~uVar6 | uVar34) ^ uVar29;
  uVar18 = uVar29 & uVar7 ^ uVar15;
  uVar8 = uVar8 ^ uVar33;
  uVar26 = uVar8 << 0x1c | uVar8 >> 0x24;
  uVar25 = uVar25 ^ uVar39;
  uVar28 = uVar25 << 0x14 | uVar25 >> 0x2c;
  uVar22 = uVar22 ^ uVar12;
  uVar9 = uVar22 << 3 | uVar22 >> 0x3d;
  uVar6 = uVar7 ^ 0x8000000000000080 ^ (uVar29 | uVar6);
  uVar38 = uVar38 ^ uVar16;
  uVar21 = uVar38 << 0x2d | uVar38 >> 0x13;
  uVar34 = (uVar15 | uVar7) ^ uVar34;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 << 0x3d | uVar24 >> 3;
  uVar29 = (uVar28 | uVar9) ^ uVar26;
  uVar15 = (~uVar24 | uVar21) ^ uVar9;
  uVar9 = uVar9 & uVar21 ^ uVar28;
  uVar28 = uVar28 & uVar26 ^ uVar24;
  uVar11 = uVar11 ^ uVar30;
  uVar11 = uVar11 << 6 | uVar11 >> 0x3a;
  uVar10 = uVar10 ^ uVar33;
  uVar8 = uVar10 << 0x19 | uVar10 >> 0x27;
  uVar21 = (uVar24 | uVar26) ^ uVar21;
  uVar2 = uVar2 ^ uVar39;
  uVar10 = uVar2 << 8 | uVar2 >> 0x38;
  uVar20 = uVar20 ^ uVar12;
  uVar7 = uVar20 << 0x12 | uVar20 >> 0x2e;
  uVar2 = ~uVar10;
  uVar20 = uVar7 & uVar2 ^ uVar8;
  uVar5 = uVar5 ^ uVar16;
  uVar24 = uVar5 << 1 | (ulong)((long)uVar5 < 0);
  uVar25 = uVar8 & uVar10 ^ uVar11;
  uVar38 = uVar11 & uVar24 ^ uVar7;
  uVar8 = (uVar11 | uVar8) ^ uVar24;
  uVar2 = (uVar7 | uVar24) ^ uVar2;
  uVar3 = uVar3 ^ uVar12;
  uVar10 = uVar3 << 0x24 | uVar3 >> 0x1c;
  uVar23 = uVar23 ^ uVar16;
  uVar11 = uVar23 << 10 | uVar23 >> 0x36;
  uVar13 = uVar13 ^ uVar30;
  uVar24 = uVar13 << 0xf | uVar13 >> 0x31;
  uVar4 = uVar4 ^ uVar33;
  uVar7 = uVar4 << 0x38 | uVar4 >> 8;
  uVar5 = (uVar11 | uVar24) ^ uVar10;
  uVar24 = ~uVar24;
  uVar4 = (uVar7 | uVar24) ^ uVar11;
  uVar1 = uVar1 ^ uVar39;
  uVar3 = uVar1 << 0x1b | uVar1 >> 0x25;
  uVar23 = (uVar10 | uVar3) ^ uVar7;
  uVar22 = uVar10 & uVar11 ^ uVar3;
  uVar24 = uVar7 & uVar3 ^ uVar24;
  uVar30 = uVar30 ^ uVar27;
  uVar33 = uVar33 ^ uVar19;
  uVar39 = uVar39 ^ uVar14;
  uVar12 = uVar12 ^ uVar17;
  uVar16 = uVar16 ^ uVar31;
  uVar17 = uVar30 << 0x3e | uVar30 >> 2;
  uVar13 = uVar33 << 0x37 | uVar33 >> 9;
  uVar27 = uVar39 << 0x27 | uVar39 >> 0x19;
  uVar3 = uVar12 << 0x29 | uVar12 >> 0x17;
  uVar33 = uVar16 << 2 | uVar16 >> 0x3e;
  uVar1 = ~uVar13;
  uVar11 = (uVar33 | uVar17) ^ uVar3;
  uVar26 = uVar3 & uVar33 ^ uVar27;
  uVar19 = uVar27 & uVar1 ^ uVar17;
  uVar10 = uVar22 ^ uVar19 ^ uVar29 ^ uVar8 ^ uVar6;
  uVar1 = (uVar27 | uVar3) ^ uVar1;
  uVar7 = uVar24 ^ uVar11 ^ uVar34 ^ uVar21 ^ uVar2;
  uVar33 = uVar13 & uVar17 ^ uVar33;
  uVar27 = uVar25 ^ uVar5 ^ uVar36 ^ uVar9 ^ uVar1;
  uVar30 = uVar20 ^ uVar4 ^ uVar32 ^ uVar15 ^ uVar26;
  uVar39 = uVar38 ^ uVar23 ^ uVar18 ^ uVar28 ^ uVar33;
  uVar16 = (uVar7 << 1 | (ulong)((long)uVar7 < 0)) ^ uVar27;
  uVar31 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar39;
  uVar3 = (uVar30 << 1 | (ulong)((long)uVar30 < 0)) ^ uVar10;
  uVar30 = (uVar39 << 1 | (ulong)((long)uVar39 < 0)) ^ uVar30;
  uVar9 = uVar9 ^ uVar3;
  uVar27 = uVar9 << 0x2c | uVar9 >> 0x14;
  uVar7 = (uVar10 << 1 | (ulong)((long)uVar10 < 0)) ^ uVar7;
  uVar20 = uVar20 ^ uVar16;
  uVar9 = uVar20 << 0x2b | uVar20 >> 0x15;
  uVar6 = uVar6 ^ uVar31;
  uVar20 = uVar6 ^ 0x800a ^ (uVar27 | uVar9);
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 << 0x15 | uVar24 >> 0x2b;
  uVar33 = uVar33 ^ uVar7;
  uVar10 = uVar33 << 0xe | uVar33 >> 0x32;
  uVar33 = uVar24 & uVar10 ^ uVar9;
  uVar12 = (~uVar9 | uVar24) ^ uVar27;
  uVar14 = uVar27 & uVar6 ^ uVar10;
  uVar34 = uVar34 ^ uVar30;
  uVar17 = uVar34 << 0x1c | uVar34 >> 0x24;
  uVar28 = uVar28 ^ uVar7;
  uVar39 = uVar28 << 0x14 | uVar28 >> 0x2c;
  uVar24 = (uVar10 | uVar6) ^ uVar24;
  uVar8 = uVar8 ^ uVar31;
  uVar27 = uVar8 << 3 | uVar8 >> 0x3d;
  uVar5 = uVar5 ^ uVar3;
  uVar9 = uVar5 << 0x2d | uVar5 >> 0x13;
  uVar26 = uVar26 ^ uVar16;
  uVar28 = uVar26 << 0x3d | uVar26 >> 3;
  uVar8 = (uVar39 | uVar27) ^ uVar17;
  uVar5 = (~uVar28 | uVar9) ^ uVar27;
  uVar27 = uVar27 & uVar9 ^ uVar39;
  uVar15 = uVar15 ^ uVar16;
  uVar6 = uVar15 << 6 | uVar15 >> 0x3a;
  uVar39 = uVar39 & uVar17 ^ uVar28;
  uVar2 = uVar2 ^ uVar30;
  uVar13 = uVar2 << 0x19 | uVar2 >> 0x27;
  uVar23 = uVar23 ^ uVar7;
  uVar10 = uVar23 << 8 | uVar23 >> 0x38;
  uVar19 = uVar19 ^ uVar31;
  uVar23 = uVar19 << 0x12 | uVar19 >> 0x2e;
  uVar9 = (uVar28 | uVar17) ^ uVar9;
  uVar15 = ~uVar10;
  uVar2 = uVar23 & uVar15 ^ uVar13;
  uVar36 = uVar36 ^ uVar3;
  uVar36 = uVar36 << 1 | (ulong)((long)uVar36 < 0);
  uVar28 = uVar13 & uVar10 ^ uVar6;
  uVar19 = uVar6 & uVar36 ^ uVar23;
  uVar26 = (uVar6 | uVar13) ^ uVar36;
  uVar15 = (uVar23 | uVar36) ^ uVar15;
  uVar18 = uVar18 ^ uVar7;
  uVar10 = uVar18 << 0x1b | uVar18 >> 0x25;
  uVar29 = uVar29 ^ uVar31;
  uVar36 = uVar29 << 0x24 | uVar29 >> 0x1c;
  uVar25 = uVar25 ^ uVar3;
  uVar13 = uVar25 << 10 | uVar25 >> 0x36;
  uVar37 = uVar36 & uVar13 ^ uVar10;
  uVar4 = uVar4 ^ uVar16;
  uVar29 = uVar4 << 0xf | uVar4 >> 0x31;
  uVar17 = (uVar13 | uVar29) ^ uVar36;
  uVar11 = uVar11 ^ uVar30;
  uVar4 = uVar11 << 0x38 | uVar11 >> 8;
  uVar29 = ~uVar29;
  uVar13 = (uVar4 | uVar29) ^ uVar13;
  uVar23 = (uVar36 | uVar10) ^ uVar4;
  uVar29 = uVar4 & uVar10 ^ uVar29;
  uVar16 = uVar16 ^ uVar32;
  uVar30 = uVar30 ^ uVar21;
  uVar7 = uVar7 ^ uVar38;
  uVar31 = uVar31 ^ uVar22;
  uVar3 = uVar3 ^ uVar1;
  uVar10 = uVar16 << 0x3e | uVar16 >> 2;
  uVar1 = uVar30 << 0x37 | uVar30 >> 9;
  uVar36 = uVar7 << 0x27 | uVar7 >> 0x19;
  uVar11 = uVar31 << 0x29 | uVar31 >> 0x17;
  uVar4 = uVar3 << 2 | uVar3 >> 0x3e;
  uVar3 = ~uVar1;
  uVar31 = (uVar4 | uVar10) ^ uVar11;
  uVar16 = uVar11 & uVar4 ^ uVar36;
  uVar35 = (uVar36 | uVar11) ^ uVar3;
  uVar36 = uVar36 & uVar3 ^ uVar10;
  uVar4 = uVar1 & uVar10 ^ uVar4;
  uVar11 = uVar26 ^ uVar37 ^ uVar20 ^ uVar8 ^ uVar36;
  uVar21 = uVar28 ^ uVar17 ^ uVar12 ^ uVar27 ^ uVar35;
  uVar3 = uVar2 ^ uVar13 ^ uVar33 ^ uVar5 ^ uVar16;
  uVar25 = uVar15 ^ uVar29 ^ uVar24 ^ uVar9 ^ uVar31;
  uVar10 = (uVar25 << 1 | (ulong)((long)uVar25 < 0)) ^ uVar21;
  uVar1 = uVar19 ^ uVar23 ^ uVar14 ^ uVar39 ^ uVar4;
  uVar34 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar1;
  uVar32 = (uVar1 << 1 | (ulong)((long)uVar1 < 0)) ^ uVar3;
  uVar1 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar11;
  uVar25 = (uVar11 << 1 | (ulong)((long)uVar11 < 0)) ^ uVar25;
  uVar20 = uVar20 ^ uVar34;
  uVar27 = uVar27 ^ uVar1;
  uVar27 = uVar27 << 0x2c | uVar27 >> 0x14;
  uVar2 = uVar2 ^ uVar10;
  uVar2 = uVar2 << 0x2b | uVar2 >> 0x15;
  uVar11 = uVar20 ^ 0x800000008000000a ^ (uVar27 | uVar2);
  uVar29 = uVar29 ^ uVar32;
  uVar7 = uVar29 << 0x15 | uVar29 >> 0x2b;
  uVar4 = uVar4 ^ uVar25;
  uVar29 = uVar4 << 0xe | uVar4 >> 0x32;
  uVar21 = uVar7 & uVar29 ^ uVar2;
  uVar6 = (~uVar2 | uVar7) ^ uVar27;
  uVar24 = uVar24 ^ uVar32;
  uVar24 = uVar24 << 0x1c | uVar24 >> 0x24;
  uVar39 = uVar39 ^ uVar25;
  uVar4 = uVar39 << 0x14 | uVar39 >> 0x2c;
  uVar30 = uVar27 & uVar20 ^ uVar29;
  uVar26 = uVar26 ^ uVar34;
  uVar27 = uVar26 << 3 | uVar26 >> 0x3d;
  uVar17 = uVar17 ^ uVar1;
  uVar18 = uVar17 << 0x2d | uVar17 >> 0x13;
  uVar16 = uVar16 ^ uVar10;
  uVar39 = uVar16 << 0x3d | uVar16 >> 3;
  uVar7 = (uVar29 | uVar20) ^ uVar7;
  uVar3 = (uVar4 | uVar27) ^ uVar24;
  uVar2 = (~uVar39 | uVar18) ^ uVar27;
  uVar16 = uVar27 & uVar18 ^ uVar4;
  uVar38 = uVar4 & uVar24 ^ uVar39;
  uVar5 = uVar5 ^ uVar10;
  uVar27 = uVar5 << 6 | uVar5 >> 0x3a;
  uVar15 = uVar15 ^ uVar32;
  uVar15 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar23 = uVar23 ^ uVar25;
  uVar29 = uVar23 << 8 | uVar23 >> 0x38;
  uVar18 = (uVar39 | uVar24) ^ uVar18;
  uVar36 = uVar36 ^ uVar34;
  uVar4 = uVar36 << 0x12 | uVar36 >> 0x2e;
  uVar24 = ~uVar29;
  uVar17 = uVar4 & uVar24 ^ uVar15;
  uVar12 = uVar12 ^ uVar1;
  uVar36 = uVar12 << 1 | (ulong)((long)uVar12 < 0);
  uVar5 = uVar15 & uVar29 ^ uVar27;
  uVar22 = uVar27 & uVar36 ^ uVar4;
  uVar20 = (uVar27 | uVar15) ^ uVar36;
  uVar14 = uVar14 ^ uVar25;
  uVar23 = uVar14 << 0x1b | uVar14 >> 0x25;
  uVar24 = (uVar4 | uVar36) ^ uVar24;
  uVar8 = uVar8 ^ uVar34;
  uVar39 = uVar8 << 0x24 | uVar8 >> 0x1c;
  uVar28 = uVar28 ^ uVar1;
  uVar27 = uVar28 << 10 | uVar28 >> 0x36;
  uVar13 = uVar13 ^ uVar10;
  uVar36 = uVar13 << 0xf | uVar13 >> 0x31;
  uVar31 = uVar31 ^ uVar32;
  uVar29 = uVar31 << 0x38 | uVar31 >> 8;
  uVar40 = uVar39 & uVar27 ^ uVar23;
  uVar15 = ~uVar36;
  uVar4 = (uVar29 | uVar15) ^ uVar27;
  uVar12 = (uVar27 | uVar36) ^ uVar39;
  uVar8 = (uVar39 | uVar23) ^ uVar29;
  uVar15 = uVar29 & uVar23 ^ uVar15;
  uVar10 = uVar10 ^ uVar33;
  uVar32 = uVar32 ^ uVar9;
  uVar25 = uVar25 ^ uVar19;
  uVar34 = uVar34 ^ uVar37;
  uVar9 = uVar10 << 0x3e | uVar10 >> 2;
  uVar33 = uVar32 << 0x37 | uVar32 >> 9;
  uVar36 = uVar25 << 0x27 | uVar25 >> 0x19;
  uVar27 = uVar34 << 0x29 | uVar34 >> 0x17;
  uVar1 = uVar1 ^ uVar35;
  uVar23 = uVar1 << 2 | uVar1 >> 0x3e;
  uVar29 = ~uVar33;
  uVar25 = (uVar23 | uVar9) ^ uVar27;
  uVar13 = uVar27 & uVar23 ^ uVar36;
  uVar27 = (uVar36 | uVar27) ^ uVar29;
  uVar10 = uVar12 ^ uVar27 ^ uVar16 ^ uVar5 ^ uVar6;
  uVar39 = uVar36 & uVar29 ^ uVar9;
  uVar23 = uVar33 & uVar9 ^ uVar23;
  uVar33 = uVar20 ^ uVar40 ^ uVar11 ^ uVar3 ^ uVar39;
  uVar34 = uVar17 ^ uVar4 ^ uVar21 ^ uVar2 ^ uVar13;
  uVar26 = uVar24 ^ uVar15 ^ uVar7 ^ uVar18 ^ uVar25;
  uVar28 = uVar22 ^ uVar8 ^ uVar30 ^ uVar38 ^ uVar23;
  uVar36 = (uVar10 << 1 | (ulong)((long)uVar10 < 0)) ^ uVar28;
  uVar29 = (uVar34 << 1 | (ulong)((long)uVar34 < 0)) ^ uVar33;
  uVar16 = uVar16 ^ uVar29;
  uVar1 = uVar16 << 0x2c | uVar16 >> 0x14;
  uVar10 = (uVar26 << 1 | (ulong)((long)uVar26 < 0)) ^ uVar10;
  uVar17 = uVar17 ^ uVar10;
  uVar9 = uVar17 << 0x2b | uVar17 >> 0x15;
  uVar34 = (uVar28 << 1 | (ulong)((long)uVar28 < 0)) ^ uVar34;
  uVar15 = uVar15 ^ uVar34;
  uVar16 = uVar15 << 0x15 | uVar15 >> 0x2b;
  uVar26 = (uVar33 << 1 | (ulong)((long)uVar33 < 0)) ^ uVar26;
  uVar23 = uVar23 ^ uVar26;
  uVar23 = uVar23 << 0xe | uVar23 >> 0x32;
  uVar11 = uVar11 ^ uVar36;
  uVar33 = uVar16 & uVar23 ^ uVar9;
  uVar28 = (~uVar9 | uVar16) ^ uVar1;
  uVar14 = uVar1 & uVar11 ^ uVar23;
  uVar7 = uVar7 ^ uVar34;
  uVar7 = uVar7 << 0x1c | uVar7 >> 0x24;
  uVar38 = uVar38 ^ uVar26;
  uVar38 = uVar38 << 0x14 | uVar38 >> 0x2c;
  uVar20 = uVar20 ^ uVar36;
  uVar15 = uVar20 << 3 | uVar20 >> 0x3d;
  uVar12 = uVar12 ^ uVar29;
  uVar19 = uVar12 << 0x2d | uVar12 >> 0x13;
  uVar32 = uVar11 ^ 0x8000000080008081 ^ (uVar1 | uVar9);
  uVar13 = uVar13 ^ uVar10;
  uVar12 = uVar13 << 0x3d | uVar13 >> 3;
  uVar16 = (uVar23 | uVar11) ^ uVar16;
  uVar1 = (uVar38 | uVar15) ^ uVar7;
  uVar23 = (~uVar12 | uVar19) ^ uVar15;
  uVar13 = uVar15 & uVar19 ^ uVar38;
  uVar38 = uVar38 & uVar7 ^ uVar12;
  uVar2 = uVar2 ^ uVar10;
  uVar15 = uVar2 << 6 | uVar2 >> 0x3a;
  uVar24 = uVar24 ^ uVar34;
  uVar9 = uVar24 << 0x19 | uVar24 >> 0x27;
  uVar8 = uVar8 ^ uVar26;
  uVar11 = uVar8 << 8 | uVar8 >> 0x38;
  uVar19 = (uVar12 | uVar7) ^ uVar19;
  uVar39 = uVar39 ^ uVar36;
  uVar7 = uVar39 << 0x12 | uVar39 >> 0x2e;
  uVar12 = ~uVar11;
  uVar24 = uVar7 & uVar12 ^ uVar9;
  uVar6 = uVar6 ^ uVar29;
  uVar2 = uVar6 << 1 | (ulong)((long)uVar6 < 0);
  uVar8 = uVar9 & uVar11 ^ uVar15;
  uVar11 = uVar15 & uVar2 ^ uVar7;
  uVar31 = (uVar15 | uVar9) ^ uVar2;
  uVar3 = uVar3 ^ uVar36;
  uVar15 = uVar3 << 0x24 | uVar3 >> 0x1c;
  uVar12 = (uVar7 | uVar2) ^ uVar12;
  uVar5 = uVar5 ^ uVar29;
  uVar3 = uVar5 << 10 | uVar5 >> 0x36;
  uVar4 = uVar4 ^ uVar10;
  uVar39 = uVar4 << 0xf | uVar4 >> 0x31;
  uVar37 = (uVar3 | uVar39) ^ uVar15;
  uVar25 = uVar25 ^ uVar34;
  uVar5 = uVar25 << 0x38 | uVar25 >> 8;
  uVar39 = ~uVar39;
  uVar9 = (uVar5 | uVar39) ^ uVar3;
  uVar30 = uVar30 ^ uVar26;
  uVar4 = uVar30 << 0x1b | uVar30 >> 0x25;
  uVar2 = (uVar15 | uVar4) ^ uVar5;
  uVar30 = uVar15 & uVar3 ^ uVar4;
  uVar39 = uVar5 & uVar4 ^ uVar39;
  uVar10 = uVar10 ^ uVar21;
  uVar34 = uVar34 ^ uVar18;
  uVar26 = uVar26 ^ uVar22;
  uVar36 = uVar36 ^ uVar40;
  uVar29 = uVar29 ^ uVar27;
  uVar10 = uVar10 << 0x3e | uVar10 >> 2;
  uVar3 = uVar34 << 0x37 | uVar34 >> 9;
  uVar15 = uVar26 << 0x27 | uVar26 >> 0x19;
  uVar27 = uVar36 << 0x29 | uVar36 >> 0x17;
  uVar36 = uVar29 << 2 | uVar29 >> 0x3e;
  uVar22 = ~uVar3;
  uVar5 = (uVar36 | uVar10) ^ uVar27;
  uVar18 = uVar27 & uVar36 ^ uVar15;
  uVar26 = uVar15 & uVar22 ^ uVar10;
  uVar4 = uVar30 ^ uVar26 ^ uVar1 ^ uVar31 ^ uVar32;
  uVar22 = (uVar15 | uVar27) ^ uVar22;
  uVar27 = uVar39 ^ uVar5 ^ uVar16 ^ uVar19 ^ uVar12;
  uVar36 = uVar3 & uVar10 ^ uVar36;
  uVar7 = uVar8 ^ uVar37 ^ uVar28 ^ uVar13 ^ uVar22;
  uVar3 = uVar24 ^ uVar9 ^ uVar33 ^ uVar23 ^ uVar18;
  uVar29 = uVar11 ^ uVar2 ^ uVar14 ^ uVar38 ^ uVar36;
  uVar17 = (uVar7 << 1 | (ulong)((long)uVar7 < 0)) ^ uVar29;
  uVar6 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar4;
  uVar7 = (uVar27 << 1 | (ulong)((long)uVar27 < 0)) ^ uVar7;
  uVar13 = uVar13 ^ uVar6;
  uVar15 = uVar13 << 0x2c | uVar13 >> 0x14;
  uVar3 = (uVar29 << 1 | (ulong)((long)uVar29 < 0)) ^ uVar3;
  uVar24 = uVar24 ^ uVar7;
  uVar29 = uVar24 << 0x2b | uVar24 >> 0x15;
  uVar27 = (uVar4 << 1 | (ulong)((long)uVar4 < 0)) ^ uVar27;
  uVar39 = uVar39 ^ uVar3;
  uVar25 = uVar39 << 0x15 | uVar39 >> 0x2b;
  uVar32 = uVar32 ^ uVar17;
  uVar36 = uVar36 ^ uVar27;
  uVar4 = uVar36 << 0xe | uVar36 >> 0x32;
  uVar39 = uVar32 ^ 0x8000000000008080 ^ (uVar15 | uVar29);
  uVar21 = uVar25 & uVar4 ^ uVar29;
  uVar24 = (~uVar29 | uVar25) ^ uVar15;
  uVar16 = uVar16 ^ uVar3;
  uVar10 = uVar16 << 0x1c | uVar16 >> 0x24;
  uVar20 = uVar15 & uVar32 ^ uVar4;
  uVar38 = uVar38 ^ uVar27;
  uVar29 = uVar38 << 0x14 | uVar38 >> 0x2c;
  uVar31 = uVar31 ^ uVar17;
  uVar36 = uVar31 << 3 | uVar31 >> 0x3d;
  uVar37 = uVar37 ^ uVar6;
  uVar34 = uVar37 << 0x2d | uVar37 >> 0x13;
  uVar25 = (uVar4 | uVar32) ^ uVar25;
  uVar18 = uVar18 ^ uVar7;
  uVar15 = uVar18 << 0x3d | uVar18 >> 3;
  uVar31 = (uVar29 | uVar36) ^ uVar10;
  uVar4 = (~uVar15 | uVar34) ^ uVar36;
  uVar36 = uVar36 & uVar34 ^ uVar29;
  uVar38 = uVar29 & uVar10 ^ uVar15;
  uVar23 = uVar23 ^ uVar7;
  uVar29 = uVar23 << 6 | uVar23 >> 0x3a;
  uVar12 = uVar12 ^ uVar3;
  uVar16 = uVar12 << 0x19 | uVar12 >> 0x27;
  uVar34 = (uVar15 | uVar10) ^ uVar34;
  uVar2 = uVar2 ^ uVar27;
  uVar10 = uVar2 << 8 | uVar2 >> 0x38;
  uVar26 = uVar26 ^ uVar17;
  uVar13 = uVar26 << 0x12 | uVar26 >> 0x2e;
  uVar15 = ~uVar10;
  uVar12 = uVar13 & uVar15 ^ uVar16;
  uVar28 = uVar28 ^ uVar6;
  uVar2 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  uVar18 = uVar16 & uVar10 ^ uVar29;
  uVar23 = uVar29 & uVar2 ^ uVar13;
  uVar26 = (uVar29 | uVar16) ^ uVar2;
  uVar15 = (uVar13 | uVar2) ^ uVar15;
  uVar14 = uVar14 ^ uVar27;
  uVar28 = uVar14 << 0x1b | uVar14 >> 0x25;
  uVar1 = uVar1 ^ uVar17;
  uVar29 = uVar1 << 0x24 | uVar1 >> 0x1c;
  uVar8 = uVar8 ^ uVar6;
  uVar2 = uVar8 << 10 | uVar8 >> 0x36;
  uVar1 = uVar29 & uVar2 ^ uVar28;
  uVar9 = uVar9 ^ uVar7;
  uVar8 = uVar9 << 0xf | uVar9 >> 0x31;
  uVar10 = (uVar2 | uVar8) ^ uVar29;
  uVar5 = uVar5 ^ uVar3;
  uVar16 = uVar5 << 0x38 | uVar5 >> 8;
  uVar8 = ~uVar8;
  uVar2 = (uVar16 | uVar8) ^ uVar2;
  uVar9 = (uVar29 | uVar28) ^ uVar16;
  uVar8 = uVar16 & uVar28 ^ uVar8;
  uVar7 = uVar7 ^ uVar33;
  uVar3 = uVar3 ^ uVar19;
  uVar27 = uVar27 ^ uVar11;
  uVar17 = uVar17 ^ uVar30;
  uVar33 = uVar7 << 0x3e | uVar7 >> 2;
  uVar3 = uVar3 << 0x37 | uVar3 >> 9;
  uVar16 = uVar27 << 0x27 | uVar27 >> 0x19;
  uVar5 = uVar17 << 0x29 | uVar17 >> 0x17;
  uVar6 = uVar6 ^ uVar22;
  uVar11 = uVar6 << 2 | uVar6 >> 0x3e;
  uVar29 = ~uVar3;
  uVar19 = (uVar11 | uVar33) ^ uVar5;
  uVar27 = uVar5 & uVar11 ^ uVar16;
  uVar14 = (uVar16 | uVar5) ^ uVar29;
  uVar30 = uVar16 & uVar29 ^ uVar33;
  uVar11 = uVar3 & uVar33 ^ uVar11;
  uVar3 = uVar26 ^ uVar1 ^ uVar39 ^ uVar31 ^ uVar30;
  uVar33 = uVar18 ^ uVar10 ^ uVar24 ^ uVar36 ^ uVar14;
  uVar32 = uVar12 ^ uVar2 ^ uVar21 ^ uVar4 ^ uVar27;
  uVar17 = uVar15 ^ uVar8 ^ uVar25 ^ uVar34 ^ uVar19;
  uVar16 = uVar23 ^ uVar9 ^ uVar20 ^ uVar38 ^ uVar11;
  uVar29 = (uVar17 << 1 | (ulong)((long)uVar17 < 0)) ^ uVar33;
  uVar22 = (uVar33 << 1 | (ulong)((long)uVar33 < 0)) ^ uVar16;
  uVar28 = (uVar32 << 1 | (ulong)((long)uVar32 < 0)) ^ uVar3;
  uVar32 = (uVar16 << 1 | (ulong)((long)uVar16 < 0)) ^ uVar32;
  uVar36 = uVar36 ^ uVar28;
  uVar33 = uVar36 << 0x2c | uVar36 >> 0x14;
  uVar17 = (uVar3 << 1 | (ulong)((long)uVar3 < 0)) ^ uVar17;
  uVar12 = uVar12 ^ uVar29;
  uVar3 = uVar12 << 0x2b | uVar12 >> 0x15;
  uVar39 = uVar39 ^ uVar22;
  uVar7 = uVar39 ^ 0x80000001 ^ (uVar33 | uVar3);
  uVar8 = uVar8 ^ uVar32;
  uVar13 = uVar8 << 0x15 | uVar8 >> 0x2b;
  uVar11 = uVar11 ^ uVar17;
  uVar36 = uVar11 << 0xe | uVar11 >> 0x32;
  uVar11 = uVar13 & uVar36 ^ uVar3;
  uVar8 = (~uVar3 | uVar13) ^ uVar33;
  uVar3 = uVar33 & uVar39 ^ uVar36;
  uVar25 = uVar25 ^ uVar32;
  uVar12 = uVar25 << 0x1c | uVar25 >> 0x24;
  uVar38 = uVar38 ^ uVar17;
  uVar33 = uVar38 << 0x14 | uVar38 >> 0x2c;
  uVar13 = (uVar36 | uVar39) ^ uVar13;
  uVar26 = uVar26 ^ uVar22;
  uVar6 = uVar26 << 3 | uVar26 >> 0x3d;
  uVar10 = uVar10 ^ uVar28;
  uVar36 = uVar10 << 0x2d | uVar10 >> 0x13;
  uVar27 = uVar27 ^ uVar29;
  uVar27 = uVar27 << 0x3d | uVar27 >> 3;
  uVar16 = (uVar33 | uVar6) ^ uVar12;
  uVar5 = (~uVar27 | uVar36) ^ uVar6;
  uVar6 = uVar6 & uVar36 ^ uVar33;
  uVar4 = uVar4 ^ uVar29;
  uVar4 = uVar4 << 6 | uVar4 >> 0x3a;
  uVar39 = uVar33 & uVar12 ^ uVar27;
  uVar15 = uVar15 ^ uVar32;
  uVar25 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar9 = uVar9 ^ uVar17;
  uVar10 = uVar9 << 8 | uVar9 >> 0x38;
  uVar30 = uVar30 ^ uVar22;
  uVar33 = uVar30 << 0x12 | uVar30 >> 0x2e;
  uVar36 = (uVar27 | uVar12) ^ uVar36;
  uVar15 = ~uVar10;
  uVar38 = uVar33 & uVar15 ^ uVar25;
  uVar24 = uVar24 ^ uVar28;
  uVar27 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  uVar26 = uVar25 & uVar10 ^ uVar4;
  uVar30 = uVar4 & uVar27 ^ uVar33;
  uVar24 = (uVar4 | uVar25) ^ uVar27;
  uVar15 = (uVar33 | uVar27) ^ uVar15;
  uVar20 = uVar20 ^ uVar17;
  uVar9 = uVar20 << 0x1b | uVar20 >> 0x25;
  uVar31 = uVar31 ^ uVar22;
  uVar10 = uVar31 << 0x24 | uVar31 >> 0x1c;
  uVar18 = uVar18 ^ uVar28;
  uVar33 = uVar18 << 10 | uVar18 >> 0x36;
  uVar31 = uVar10 & uVar33 ^ uVar9;
  uVar2 = uVar2 ^ uVar29;
  uVar4 = uVar2 << 0xf | uVar2 >> 0x31;
  uVar19 = uVar19 ^ uVar32;
  uVar27 = uVar19 << 0x38 | uVar19 >> 8;
  uVar2 = ~uVar4;
  uVar25 = (uVar27 | uVar2) ^ uVar33;
  uVar33 = (uVar33 | uVar4) ^ uVar10;
  uVar10 = (uVar10 | uVar9) ^ uVar27;
  uVar2 = uVar27 & uVar9 ^ uVar2;
  uVar29 = uVar29 ^ uVar21;
  uVar32 = uVar32 ^ uVar34;
  uVar17 = uVar17 ^ uVar23;
  uVar22 = uVar22 ^ uVar1;
  uVar28 = uVar28 ^ uVar14;
  uVar4 = uVar29 << 0x3e | uVar29 >> 2;
  uVar12 = uVar32 << 0x37 | uVar32 >> 9;
  uVar9 = uVar17 << 0x27 | uVar17 >> 0x19;
  uVar23 = uVar22 << 0x29 | uVar22 >> 0x17;
  uVar1 = uVar28 << 2 | uVar28 >> 0x3e;
  uVar29 = ~uVar12;
  uVar20 = (uVar1 | uVar4) ^ uVar23;
  uVar27 = uVar23 & uVar1 ^ uVar9;
  uVar19 = (uVar9 | uVar23) ^ uVar29;
  uVar21 = uVar33 ^ uVar19 ^ uVar6 ^ uVar26 ^ uVar8;
  uVar14 = uVar9 & uVar29 ^ uVar4;
  uVar1 = uVar12 & uVar4 ^ uVar1;
  uVar4 = uVar24 ^ uVar31 ^ uVar7 ^ uVar16 ^ uVar14;
  uVar29 = uVar38 ^ uVar25 ^ uVar11 ^ uVar5 ^ uVar27;
  uVar9 = uVar15 ^ uVar2 ^ uVar13 ^ uVar36 ^ uVar20;
  uVar34 = (uVar9 << 1 | (ulong)((long)uVar9 < 0)) ^ uVar21;
  uVar23 = uVar30 ^ uVar10 ^ uVar3 ^ uVar39 ^ uVar1;
  uVar28 = (uVar21 << 1 | (ulong)((long)uVar21 < 0)) ^ uVar23;
  uVar17 = (uVar23 << 1 | (ulong)((long)uVar23 < 0)) ^ uVar29;
  uVar23 = (uVar29 << 1 | (ulong)((long)uVar29 < 0)) ^ uVar4;
  uVar9 = (uVar4 << 1 | (ulong)((long)uVar4 < 0)) ^ uVar9;
  uVar7 = uVar7 ^ uVar28;
  uVar6 = uVar6 ^ uVar23;
  uVar12 = uVar6 << 0x2c | uVar6 >> 0x14;
  uVar38 = uVar38 ^ uVar34;
  uVar21 = uVar38 << 0x2b | uVar38 >> 0x15;
  uVar2 = uVar2 ^ uVar17;
  uVar6 = uVar2 << 0x15 | uVar2 >> 0x2b;
  uVar1 = uVar1 ^ uVar9;
  uVar22 = uVar1 << 0xe | uVar1 >> 0x32;
  uVar13 = uVar13 ^ uVar17;
  uVar38 = uVar13 << 0x1c | uVar13 >> 0x24;
  uVar39 = uVar39 ^ uVar9;
  uVar2 = uVar39 << 0x14 | uVar39 >> 0x2c;
  uVar24 = uVar24 ^ uVar28;
  uVar1 = uVar24 << 3 | uVar24 >> 0x3d;
  uVar33 = uVar33 ^ uVar23;
  uVar13 = uVar33 << 0x2d | uVar33 >> 0x13;
  uVar27 = uVar27 ^ uVar34;
  uVar4 = uVar27 << 0x3d | uVar27 >> 3;
  uVar5 = uVar5 ^ uVar34;
  uVar32 = uVar5 << 6 | uVar5 >> 0x3a;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x19 | uVar15 >> 0x27;
  uVar10 = uVar10 ^ uVar9;
  uVar27 = uVar10 << 8 | uVar10 >> 0x38;
  uVar14 = uVar14 ^ uVar28;
  uVar14 = uVar14 << 0x12 | uVar14 >> 0x2e;
  uVar29 = ~uVar27;
  uVar8 = uVar8 ^ uVar23;
  uVar10 = uVar8 << 1 | (ulong)((long)uVar8 < 0);
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x1b | uVar3 >> 0x25;
  uVar16 = uVar16 ^ uVar28;
  uVar8 = uVar16 << 0x24 | uVar16 >> 0x1c;
  uVar26 = uVar26 ^ uVar23;
  uVar18 = uVar26 << 10 | uVar26 >> 0x36;
  uVar25 = uVar25 ^ uVar34;
  uVar24 = uVar25 << 0xf | uVar25 >> 0x31;
  uVar20 = uVar20 ^ uVar17;
  uVar25 = uVar20 << 0x38 | uVar20 >> 8;
  uVar16 = ~uVar24;
  uVar34 = uVar34 ^ uVar11;
  uVar17 = uVar17 ^ uVar36;
  uVar9 = uVar9 ^ uVar30;
  uVar28 = uVar28 ^ uVar31;
  uVar31 = uVar34 << 0x3e | uVar34 >> 2;
  uVar39 = uVar17 << 0x37 | uVar17 >> 9;
  uVar33 = uVar9 << 0x27 | uVar9 >> 0x19;
  uVar5 = uVar28 << 0x29 | uVar28 >> 0x17;
  uVar23 = uVar23 ^ uVar19;
  uVar36 = uVar23 << 2 | uVar23 >> 0x3e;
  uVar11 = ~uVar39;
  *state = uVar7 ^ 0x8000000080008008 ^ (uVar12 | uVar21);
  state[1] = (~uVar21 | uVar6) ^ uVar12;
  state[2] = uVar6 & uVar22 ^ uVar21;
  state[3] = (uVar22 | uVar7) ^ uVar6;
  state[4] = uVar12 & uVar7 ^ uVar22;
  state[5] = (uVar2 | uVar1) ^ uVar38;
  state[6] = uVar1 & uVar13 ^ uVar2;
  state[7] = (~uVar4 | uVar13) ^ uVar1;
  state[8] = (uVar4 | uVar38) ^ uVar13;
  state[9] = uVar2 & uVar38 ^ uVar4;
  state[10] = (uVar32 | uVar15) ^ uVar10;
  state[0xb] = uVar15 & uVar27 ^ uVar32;
  state[0xc] = uVar14 & uVar29 ^ uVar15;
  state[0xd] = (uVar14 | uVar10) ^ uVar29;
  state[0xe] = uVar32 & uVar10 ^ uVar14;
  state[0xf] = uVar8 & uVar18 ^ uVar3;
  state[0x10] = (uVar18 | uVar24) ^ uVar8;
  state[0x11] = (uVar25 | uVar16) ^ uVar18;
  state[0x12] = uVar25 & uVar3 ^ uVar16;
  state[0x13] = (uVar8 | uVar3) ^ uVar25;
  state[0x14] = uVar33 & uVar11 ^ uVar31;
  state[0x15] = (uVar33 | uVar5) ^ uVar11;
  state[0x16] = uVar5 & uVar36 ^ uVar33;
  state[0x17] = (uVar36 | uVar31) ^ uVar5;
  state[0x18] = uVar39 & uVar31 ^ uVar36;
  return;
}

Assistant:

static void KeccakPermutationOnWordsAfterXoring1152bits(UINT64 *state, const UINT64 *input)
{
    declareABCDE
#if (Unrolling != 24)
    unsigned int i;
#endif

    copyFromStateAndXor1152bits(A, state, input)
    rounds
#if defined(UseMMX)
    _mm_empty();
#endif
}